

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O1

ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *state,ZydisDecodedInstruction *instruction)

{
  ZyanU16 ZVar1;
  undefined2 uVar2;
  ZydisMachineMode ZVar3;
  ZydisInstructionEncoding ZVar4;
  ZydisDecoderContext *pZVar5;
  ZydisDecoderContext *pZVar6;
  uint3 uVar7;
  ulong *puVar8;
  ZydisMnemonic *pZVar9;
  undefined8 *puVar10;
  byte bVar11;
  byte bVar12;
  ZyanBool ZVar13;
  ZyanU8 ZVar14;
  ushort uVar15;
  int iVar16;
  ZyanStatus ZVar17;
  ZyanStatus ZVar18;
  ZydisMaskMode ZVar19;
  ZydisOpcodeMap ZVar20;
  uint uVar21;
  ZydisInstructionDefinitionXOP *def;
  ZydisDecodedInstruction *pZVar22;
  ZydisDecoderTreeNode *pZVar23;
  ZyanU8 ZVar24;
  uint uVar25;
  ZydisDecoderTreeNode *pZVar26;
  byte *pbVar27;
  ZyanU8 ZVar28;
  ZydisInstructionCategory ZVar29;
  ulong uVar30;
  ulong uVar31;
  ZyanU8 *pZVar32;
  uint uVar33;
  uint uVar34;
  Elf64_Ehdr *pEVar35;
  ZydisBranchType ZVar36;
  ZyanUSize ZVar37;
  long lVar38;
  byte bVar39;
  uint uVar40;
  ZydisInstructionAttributes ZVar41;
  undefined3 *puVar42;
  ulong uVar43;
  byte bVar44;
  undefined1 *puVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  byte bVar50;
  Elf64_Ehdr *unaff_R12;
  byte bVar51;
  ZyanStatus status_047620348;
  Elf64_Ehdr *pEVar52;
  Elf64_Ehdr *pEVar53;
  ZydisDecoderTreeNodeType ZVar54;
  ZydisDecoderTreeNode *node;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  ZyanU16 index;
  ZyanU8 prefix_bytes [4];
  ZydisDefinitionAccessedFlags *flags;
  ZydisInstructionEncodingInfo *info;
  ZyanU16 local_c4;
  bool local_c1;
  ZydisDecoderState *local_c0;
  ZydisDecodedInstruction *local_b8;
  ZyanBool local_ab;
  byte local_aa;
  byte local_a9;
  undefined8 local_a8;
  uint local_9c;
  byte local_97;
  char local_96;
  byte local_95;
  uint local_94;
  ZydisDecoderContext *local_90;
  uint local_84;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  uint local_64;
  ulong local_60;
  byte *local_58;
  byte *local_50;
  ulong local_48;
  ZydisDefinitionAccessedFlags *local_40;
  Elf64_Ehdr *local_38;
  
  local_c0 = state;
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1248,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  local_58 = (byte *)((long)&(instruction->raw).field_3 + 4);
  local_50 = (byte *)((long)&(instruction->raw).field_3 + 3);
  node = &zydis_decoder_tree_root;
  local_48 = 0x401000000;
  pEVar35 = (Elf64_Ehdr *)instruction;
  pZVar23 = (ZydisDecoderTreeNode *)0x0;
  local_b8 = instruction;
  do {
    ZVar54 = node->type;
    local_c4 = 0;
    ZVar14 = 'x';
    pZVar26 = pZVar23;
    switch(ZVar54) {
    case '\0':
      if (pZVar23 == (ZydisDecoderTreeNode *)0x0) {
        iVar16 = 1;
        pZVar26 = (ZydisDecoderTreeNode *)0x0;
        unaff_R12 = (Elf64_Ehdr *)0x80200001;
      }
      else {
        ZVar14 = (local_c0->prefixes).mandatory_candidate;
        ZVar54 = '\f';
        iVar16 = 3;
        if ((ZVar14 != '\0') &&
           ((((ZydisDecodedInstruction *)pEVar35)->raw).prefixes
            [(local_c0->prefixes).offset_mandatory].type = ZYDIS_PREFIX_TYPE_IGNORED, ZVar14 == 'f')
           ) {
          bVar39 = (local_c0->prefixes).offset_mandatory;
          if ((local_c0->prefixes).offset_osz_override == bVar39) {
            (((ZydisDecodedInstruction *)pEVar35)->raw).prefixes[bVar39].type =
                 ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
          pbVar27 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar35)->attributes + 5);
          *pbVar27 = *pbVar27 | 8;
        }
        pZVar26 = (ZydisDecoderTreeNode *)0x0;
        node = pZVar23;
      }
      goto LAB_00110e39;
    case '\x01':
      if (((ZydisDecodedInstruction *)pEVar35)->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
LAB_0010fe93:
        local_c4 = 0;
      }
      else {
        if (((ZydisDecodedInstruction *)pEVar35)->encoding != ZYDIS_INSTRUCTION_ENCODING_XOP) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xde4,
                        "ZyanStatus ZydisNodeHandlerXOP(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xde0,
                        "ZyanStatus ZydisNodeHandlerXOP(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        bVar39 = (((ZydisDecodedInstruction *)pEVar35)->raw).field_3.xop.pp;
        local_c4 = ((ushort)(((ZydisDecodedInstruction *)pEVar35)->raw).field_3.rex.B +
                   (ushort)bVar39 + (ushort)bVar39 * 2) - 7;
      }
      break;
    case '\x02':
      if (((ZydisDecodedInstruction *)pEVar35)->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY)
      goto LAB_0010fe93;
      if (((ZydisDecodedInstruction *)pEVar35)->encoding != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS
         ) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xdf8,
                      "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
      }
      if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x10) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 4)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xdf4,
                      "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
      }
      local_c4 = (ushort)(((ZydisDecodedInstruction *)pEVar35)->raw).field_3.rex.B +
                 (ushort)(((ZydisDecodedInstruction *)pEVar35)->raw).field_3.xop.pp * 4 + 1;
      break;
    case '\x03':
      ZVar4 = ((ZydisDecodedInstruction *)pEVar35)->encoding;
      if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xe0c,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        local_c4 = (ushort)(((ZydisDecodedInstruction *)pEVar35)->raw).field_3.rex.offset +
                   (ushort)(((ZydisDecodedInstruction *)pEVar35)->raw).field_3.xop.pp * 4 + 0x21;
      }
      else {
        if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_EVEX) {
          if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xe10,
                          "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                         );
          }
          goto LAB_0010fcab;
        }
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xe08,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        local_c4 = (ushort)(((ZydisDecodedInstruction *)pEVar35)->raw).field_3.rex.offset +
                   (ushort)(((ZydisDecodedInstruction *)pEVar35)->raw).field_3.xop.pp * 8 + 1;
      }
      break;
    case '\x04':
      if (((ZydisDecodedInstruction *)pEVar35)->encoding == ZYDIS_INSTRUCTION_ENCODING_3DNOW) {
        local_c4 = 0xc;
      }
      else {
        if (((ZydisDecodedInstruction *)pEVar35)->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
          bVar39 = ((ZydisDecodedInstruction *)pEVar35)->length;
          if (bVar39 < 0xf) {
            if (local_c0->buffer_len == 0) {
              pEVar52 = (Elf64_Ehdr *)0x80200000;
              goto LAB_00110320;
            }
            pZVar32 = local_c0->buffer;
            local_c0->buffer = pZVar32 + 1;
            ((ZydisDecodedInstruction *)pEVar35)->opcode = *pZVar32;
            ((ZydisDecodedInstruction *)pEVar35)->length = bVar39 + 1;
            local_c0->buffer_len = local_c0->buffer_len - 1;
            pEVar52 = &Elf64_Ehdr_00100000;
            bVar56 = true;
          }
          else {
            pEVar52 = (Elf64_Ehdr *)0x80200002;
LAB_00110320:
            bVar56 = false;
          }
          pEVar53 = pEVar52;
          if (!bVar56) goto LAB_001103a5;
          ZVar20 = ((ZydisDecodedInstruction *)pEVar35)->opcode_map;
          if (ZYDIS_OPCODE_MAP_MAX_VALUE < ZVar20) {
LAB_00112942:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xed5,
                          "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                         );
          }
          if ((0xe0cU >> (ZVar20 & 0x1f) & 1) != 0) goto LAB_00110396;
          if (ZVar20 != ZYDIS_OPCODE_MAP_DEFAULT) {
            if (ZVar20 != ZYDIS_OPCODE_MAP_0F) goto LAB_00112942;
            ZVar14 = ((ZydisDecodedInstruction *)pEVar35)->opcode;
            if (ZVar14 == ':') {
              ZVar20 = ZYDIS_OPCODE_MAP_0F3A;
            }
            else if (ZVar14 == '8') {
              ZVar20 = ZYDIS_OPCODE_MAP_0F38;
            }
            else {
              if (ZVar14 != '\x0f') goto LAB_00110396;
              pEVar53 = (Elf64_Ehdr *)0x80200004;
              if ((local_c0->prefixes).has_lock != '\0') goto LAB_001103a5;
              ((ZydisDecodedInstruction *)pEVar35)->encoding = ZYDIS_INSTRUCTION_ENCODING_3DNOW;
              ZVar20 = ZYDIS_OPCODE_MAP_0F0F;
            }
LAB_00111329:
            ((ZydisDecodedInstruction *)pEVar35)->opcode_map = ZVar20;
            goto LAB_00110396;
          }
          bVar39 = ((ZydisDecodedInstruction *)pEVar35)->opcode;
          if (bVar39 < 0xc4) {
            if (bVar39 == 0xf) {
              ZVar20 = ZYDIS_OPCODE_MAP_0F;
              goto LAB_00111329;
            }
            if (bVar39 == 0x62) goto LAB_00111296;
            if (bVar39 != 0x8f) goto LAB_00110396;
            bVar39 = ((ZydisDecodedInstruction *)pEVar35)->length;
            bVar56 = true;
            if (bVar39 < 0xf) {
              if (local_c0->buffer_len == 0) {
                pEVar35 = (Elf64_Ehdr *)0x80200000;
                goto LAB_00111aed;
              }
              bVar56 = (*local_c0->buffer & 0x18) == 0;
              pEVar35 = &Elf64_Ehdr_00100000;
              bVar57 = true;
            }
            else {
              pEVar35 = (Elf64_Ehdr *)0x80200002;
LAB_00111aed:
              bVar57 = false;
            }
            if (bVar57) {
              pEVar35 = pEVar52;
            }
            bVar57 = (bool)(bVar57 ^ 1);
            pEVar53 = pEVar35;
            if ((!bVar57) && (!bVar56)) {
              bVar57 = true;
              pEVar53 = (Elf64_Ehdr *)0x80200006;
              if (((local_b8->attributes & 4) == 0) &&
                 ((pEVar53 = (Elf64_Ehdr *)0x80200004, (local_c0->prefixes).has_lock == '\0' &&
                  (pEVar53 = (Elf64_Ehdr *)0x80200005,
                  (local_c0->prefixes).mandatory_candidate == '\0')))) {
                (local_b8->raw).field_3.xop.offset = bVar39 - 1;
                local_a8._2_1_ = 0;
                local_a8._0_1_ = 0x8f;
                local_a8._1_1_ = '\0';
                if (bVar39 < 0xe) {
                  uVar31 = local_c0->buffer_len;
                  if (uVar31 < 2) {
                    pEVar53 = (Elf64_Ehdr *)0x80200000;
                    goto LAB_00111ff2;
                  }
                  local_b8->length = bVar39 + 2;
                  uVar2 = *(undefined2 *)local_c0->buffer;
                  local_a8._1_1_ = (ZyanU8)uVar2;
                  local_a8._2_1_ = (byte)((ushort)uVar2 >> 8);
                  local_c0->buffer = local_c0->buffer + 2;
                  local_c0->buffer_len = uVar31 - 2;
                  pEVar53 = &Elf64_Ehdr_00100000;
                  bVar56 = true;
                }
                else {
                  pEVar53 = (Elf64_Ehdr *)0x80200002;
LAB_00111ff2:
                  bVar56 = false;
                }
                bVar57 = true;
                if (bVar56) {
                  local_b8->encoding = ZYDIS_INSTRUCTION_ENCODING_XOP;
                  ZVar18 = ZydisDecodeXOP(local_c0->context,local_b8,(ZyanU8 *)&local_a8);
                  if ((int)ZVar18 < 0) {
                    pEVar53 = (Elf64_Ehdr *)(ulong)ZVar18;
                    bVar57 = true;
                    goto LAB_00111b64;
                  }
                  ZVar20 = (local_b8->raw).field_3.rex.B + ZYDIS_OPCODE_MAP_0F;
                  pEVar52 = pEVar35;
LAB_00112127:
                  local_b8->opcode_map = ZVar20;
                  bVar57 = false;
                  pEVar53 = pEVar52;
                }
              }
            }
          }
          else {
            if (1 < bVar39 - 0xc4) goto LAB_00110396;
LAB_00111296:
            bVar46 = ((ZydisDecodedInstruction *)pEVar35)->length;
            if (bVar46 < 0xf) {
              if (local_c0->buffer_len == 0) {
                pEVar53 = (Elf64_Ehdr *)0x80200000;
                goto LAB_00111359;
              }
              bVar55 = 0xbf < *local_c0->buffer;
              pEVar53 = &Elf64_Ehdr_00100000;
              bVar56 = true;
            }
            else {
              pEVar53 = (Elf64_Ehdr *)0x80200002;
LAB_00111359:
              bVar55 = false;
              bVar56 = false;
            }
            bVar57 = true;
            if (bVar56) {
              if ((bVar55) || (local_b8->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)) {
                uVar31 = local_b8->attributes;
                pEVar53 = (Elf64_Ehdr *)0x80200006;
                if (((uVar31 & 4) == 0) &&
                   ((pEVar53 = (Elf64_Ehdr *)0x80200004, (local_c0->prefixes).has_lock == '\0' &&
                    (pEVar53 = (Elf64_Ehdr *)0x80200005,
                    (local_c0->prefixes).mandatory_candidate == '\0')))) {
                  local_a8._1_1_ = '\0';
                  local_a8._2_1_ = 0;
                  local_a8._3_1_ = '\0';
                  local_a8._0_1_ = bVar39;
                  if (bVar39 == 0x62) {
                    if ((uVar31 & 0x20) != 0) {
                      __assert_fail("!(instruction->attributes & (1ULL << 5))",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                    ,0xe51,
                                    "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                   );
                    }
                    if ((uVar31 & 0x40) != 0) {
                      __assert_fail("!(instruction->attributes & (1ULL << 6))",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                    ,0xe52,
                                    "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                   );
                    }
                    if (0xc < bVar46) goto LAB_00111fd5;
                    uVar31 = local_c0->buffer_len;
                    if (uVar31 < 3) goto LAB_00112009;
                    local_b8->length = bVar46 + 3;
                    pZVar32 = local_c0->buffer;
                    local_a8._3_1_ = pZVar32[2];
                    local_a8._1_1_ = (ZyanU8)*(undefined2 *)pZVar32;
                    local_a8._2_1_ = (byte)((ushort)*(undefined2 *)pZVar32 >> 8);
                    local_c0->buffer = pZVar32 + 3;
                    ZVar37 = uVar31 - 3;
LAB_001120ca:
                    local_c0->buffer_len = ZVar37;
LAB_001120ce:
                    pEVar53 = &Elf64_Ehdr_00100000;
                    bVar56 = true;
                  }
                  else {
                    if (bVar39 == 0xc5) {
                      (local_b8->raw).field_3.xop.offset = bVar46 - 1;
                      if ((uVar31 & 0x10) != 0) {
                        __assert_fail("!(instruction->attributes & (1ULL << 4))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                      ,0xe4b,
                                      "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                     );
                      }
                      if (bVar46 < 0xf) {
                        ZVar37 = local_c0->buffer_len;
                        if (ZVar37 != 0) {
                          pZVar32 = local_c0->buffer;
                          local_c0->buffer = pZVar32 + 1;
                          local_a8._1_1_ = *pZVar32;
                          local_b8->length = bVar46 + 1;
                          local_c0->buffer_len = ZVar37 - 1;
                          goto LAB_001120ce;
                        }
                        goto LAB_00112009;
                      }
LAB_00111fd5:
                      pEVar53 = (Elf64_Ehdr *)0x80200002;
                    }
                    else {
                      if (bVar39 != 0xc4) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                      ,0xe59,
                                      "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                     );
                      }
                      (local_b8->raw).field_3.xop.offset = bVar46 - 1;
                      if ((uVar31 & 0x10) != 0) {
                        __assert_fail("!(instruction->attributes & (1ULL << 4))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                      ,0xe45,
                                      "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                     );
                      }
                      if (0xd < bVar46) goto LAB_00111fd5;
                      uVar31 = local_c0->buffer_len;
                      if (1 < uVar31) {
                        local_b8->length = bVar46 + 2;
                        uVar2 = *(undefined2 *)local_c0->buffer;
                        local_a8._1_1_ = (ZyanU8)uVar2;
                        local_a8._2_1_ = (byte)((ushort)uVar2 >> 8);
                        local_c0->buffer = local_c0->buffer + 2;
                        ZVar37 = uVar31 - 2;
                        goto LAB_001120ca;
                      }
LAB_00112009:
                      pEVar53 = (Elf64_Ehdr *)0x80200000;
                    }
                    bVar56 = false;
                  }
                  bVar57 = true;
                  if (bVar56) {
                    if (bVar39 - 0xc4 < 2) {
                      local_b8->encoding = ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS;
                      uVar21 = ZydisDecodeVEX(local_c0->context,local_b8,(ZyanU8 *)&local_a8);
                      pbVar27 = local_50;
joined_r0x00112197:
                      if ((int)uVar21 < 0) {
                        bVar57 = true;
                        pEVar53 = (Elf64_Ehdr *)(ulong)uVar21;
                        goto LAB_00111b64;
                      }
                    }
                    else {
                      if (bVar39 != 0x62) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                      ,0xe91,
                                      "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                     );
                      }
                      ZVar14 = local_b8->length + 0xfc;
                      if ((local_a8._2_1_ & 4) != 0) {
                        (local_b8->raw).field_3.evex.offset = ZVar14;
                        local_b8->encoding = ZYDIS_INSTRUCTION_ENCODING_EVEX;
                        uVar21 = ZydisDecodeEVEX(local_c0->context,local_b8,(ZyanU8 *)&local_a8);
                        pbVar27 = local_58;
                        goto joined_r0x00112197;
                      }
                      (local_b8->raw).field_3.evex.V2 = ZVar14;
                      bVar57 = true;
                      if (local_c0->decoder->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) {
                        pEVar53 = (Elf64_Ehdr *)0x80200001;
                        goto LAB_00111b64;
                      }
                      local_b8->encoding = ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE;
                      ZVar18 = ZydisDecodeMVEX(local_c0->context,local_b8,(ZyanU8 *)&local_a8);
                      pbVar27 = local_58;
                      if ((int)ZVar18 < 0) {
                        pEVar53 = (Elf64_Ehdr *)(ulong)ZVar18;
                        goto LAB_00111b64;
                      }
                    }
                    ZVar20 = (ZydisOpcodeMap)*pbVar27;
                    goto LAB_00112127;
                  }
                }
              }
              else {
                bVar57 = false;
                pEVar53 = pEVar52;
              }
            }
          }
LAB_00111b64:
          pEVar35 = (Elf64_Ehdr *)local_b8;
          if (bVar57) goto LAB_001103a5;
        }
        else {
          bVar39 = ((ZydisDecodedInstruction *)pEVar35)->length;
          if (bVar39 < 0xf) {
            if (local_c0->buffer_len == 0) {
              pEVar53 = (Elf64_Ehdr *)0x80200000;
              goto LAB_00110390;
            }
            pZVar32 = local_c0->buffer;
            local_c0->buffer = pZVar32 + 1;
            ((ZydisDecodedInstruction *)pEVar35)->opcode = *pZVar32;
            ((ZydisDecodedInstruction *)pEVar35)->length = bVar39 + 1;
            local_c0->buffer_len = local_c0->buffer_len - 1;
            pEVar53 = &Elf64_Ehdr_00100000;
            bVar56 = true;
          }
          else {
            pEVar53 = (Elf64_Ehdr *)0x80200002;
LAB_00110390:
            bVar56 = false;
          }
          if (!bVar56) goto LAB_001103a5;
        }
LAB_00110396:
        local_c4 = (ZyanU16)((ZydisDecodedInstruction *)pEVar35)->opcode;
      }
      break;
    case '\x05':
      ZVar3 = ((ZydisDecodedInstruction *)pEVar35)->machine_mode;
      if (ZYDIS_MACHINE_MODE_MAX_VALUE < ZVar3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xefa,
                      "ZyanStatus ZydisNodeHandlerMode(const ZydisDecodedInstruction *, ZyanU16 *)")
        ;
      }
      if ((0x34U >> (ZVar3 & 0x1f) & 1) == 0) {
        if ((10U >> (ZVar3 & 0x1f) & 1) == 0) goto LAB_0010fef2;
        local_c4 = 1;
      }
      else {
LAB_0010fcab:
        local_c4 = 0;
      }
      break;
    case '\x06':
      bVar56 = ((ZydisDecodedInstruction *)pEVar35)->machine_mode == ZYDIS_MACHINE_MODE_LONG_64;
      goto LAB_0010fd95;
    case '\a':
      uVar21 = ZydisNodeHandlerModrmMod(local_c0,(ZydisDecodedInstruction *)pEVar35,&local_c4);
LAB_0010fd9d:
      pEVar53 = (Elf64_Ehdr *)(ulong)uVar21;
      goto LAB_001103a5;
    case '\b':
      uVar21 = ZydisNodeHandlerModrmMod(local_c0,(ZydisDecodedInstruction *)pEVar35,&local_c4);
      if ((int)uVar21 < 0) goto LAB_0010fd9d;
      bVar56 = local_c4 == 3;
LAB_0010fd95:
      local_c4 = (ZyanU16)!bVar56;
      break;
    case '\t':
      if ((((ZydisDecodedInstruction *)pEVar35)->raw).modrm.offset == '\0') {
        bVar39 = ((ZydisDecodedInstruction *)pEVar35)->length;
        (((ZydisDecodedInstruction *)pEVar35)->raw).modrm.offset = bVar39;
        bVar56 = true;
        if (bVar39 < 0xf) {
          ZVar37 = local_c0->buffer_len;
          if (ZVar37 == 0) {
            pEVar53 = (Elf64_Ehdr *)0x80200000;
          }
          else {
            pZVar32 = local_c0->buffer;
            local_c0->buffer = pZVar32 + 1;
            ZVar14 = *pZVar32;
            ((ZydisDecodedInstruction *)pEVar35)->length = bVar39 + 1;
            local_c0->buffer_len = ZVar37 - 1;
            pEVar53 = &Elf64_Ehdr_00100000;
            bVar56 = false;
          }
        }
        else {
          pEVar53 = (Elf64_Ehdr *)0x80200002;
        }
        if (bVar56) goto LAB_001103a5;
        ZydisDecodeModRM((ZydisDecodedInstruction *)pEVar35,ZVar14);
      }
      local_c4 = (ZyanU16)(((ZydisDecodedInstruction *)pEVar35)->raw).modrm.reg;
      break;
    case '\n':
      if ((((ZydisDecodedInstruction *)pEVar35)->raw).modrm.offset == '\0') {
        bVar39 = ((ZydisDecodedInstruction *)pEVar35)->length;
        (((ZydisDecodedInstruction *)pEVar35)->raw).modrm.offset = bVar39;
        bVar56 = true;
        if (bVar39 < 0xf) {
          ZVar37 = local_c0->buffer_len;
          if (ZVar37 == 0) {
            pEVar53 = (Elf64_Ehdr *)0x80200000;
          }
          else {
            pZVar32 = local_c0->buffer;
            local_c0->buffer = pZVar32 + 1;
            ZVar14 = *pZVar32;
            ((ZydisDecodedInstruction *)pEVar35)->length = bVar39 + 1;
            local_c0->buffer_len = ZVar37 - 1;
            pEVar53 = &Elf64_Ehdr_00100000;
            bVar56 = false;
          }
        }
        else {
          pEVar53 = (Elf64_Ehdr *)0x80200002;
        }
        if (bVar56) goto LAB_001103a5;
        ZydisDecodeModRM((ZydisDecodedInstruction *)pEVar35,ZVar14);
      }
      local_c4 = (ZyanU16)(((ZydisDecodedInstruction *)pEVar35)->raw).modrm.rm;
      break;
    case '\v':
      local_c4 = (ZyanU16)((local_c0->prefixes).group1 != '\0');
      goto LAB_0010fe86;
    case '\f':
      ZVar14 = (local_c0->prefixes).mandatory_candidate;
      if (ZVar14 == 0xf3) {
        (((ZydisDecodedInstruction *)pEVar35)->raw).prefixes[(local_c0->prefixes).offset_mandatory].
        type = ZYDIS_PREFIX_TYPE_MANDATORY;
        local_c4 = 3;
      }
      else if (ZVar14 == 0xf2) {
        (((ZydisDecodedInstruction *)pEVar35)->raw).prefixes[(local_c0->prefixes).offset_mandatory].
        type = ZYDIS_PREFIX_TYPE_MANDATORY;
        local_c4 = 4;
      }
      else if (ZVar14 == 'f') {
        (((ZydisDecodedInstruction *)pEVar35)->raw).prefixes[(local_c0->prefixes).offset_mandatory].
        type = ZYDIS_PREFIX_TYPE_MANDATORY;
        pbVar27 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar35)->attributes + 5);
        *pbVar27 = *pbVar27 & 0xf7;
        local_c4 = 2;
      }
      else {
        local_c4 = 1;
      }
      pZVar23 = ZydisDecoderTreeGetChildNode(node,0);
      break;
    case '\r':
      ZVar3 = ((ZydisDecodedInstruction *)pEVar35)->machine_mode;
      if ((ZVar3 == ZYDIS_MACHINE_MODE_LONG_64) && ((local_c0->context->vector_unified).W != '\0'))
      {
LAB_0010fef2:
        local_c4 = 2;
      }
      else {
        uVar31 = ((ZydisDecodedInstruction *)pEVar35)->attributes;
        if ((uVar31 >> 0x2b & 1) != 0) {
          (((ZydisDecodedInstruction *)pEVar35)->raw).prefixes
          [(local_c0->prefixes).offset_osz_override].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
        }
        if (ZYDIS_MACHINE_MODE_MAX_VALUE < ZVar3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xf88,
                        "ZyanStatus ZydisNodeHandlerOperandSize(const ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((0xbU >> (ZVar3 & 0x1f) & 1) == 0) {
          uVar15 = (ushort)(uint)(uVar31 >> 0x2b);
          goto LAB_0010fed2;
        }
        local_c4 = (ZyanU16)((uVar31 & 0x80000000000) == 0);
      }
      break;
    case '\x0e':
      ZVar3 = ((ZydisDecodedInstruction *)pEVar35)->machine_mode;
      if (ZYDIS_MACHINE_MODE_MAX_VALUE < ZVar3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfa8,
                      "ZyanStatus ZydisNodeHandlerAddressSize(ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((0x34U >> (ZVar3 & 0x1f) & 1) == 0) {
        if ((10U >> (ZVar3 & 0x1f) & 1) == 0) {
          local_c4 = 2 - ((((ZydisDecodedInstruction *)pEVar35)->attributes >> 0x2c & 1) != 0);
        }
        else {
          local_c4 = (ZyanU16)((((ZydisDecodedInstruction *)pEVar35)->attributes >> 0x2c & 1) == 0);
        }
      }
      else {
        uVar15 = (ushort)(uint)(((ZydisDecodedInstruction *)pEVar35)->attributes >> 0x2c);
LAB_0010fed2:
        local_c4 = uVar15 & 1;
      }
      break;
    case '\x0f':
      if (local_c0->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfb1,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(((ZydisDecodedInstruction *)pEVar35)->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfb8,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfbb,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfbe,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfc1,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfc4,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      local_c4 = (ZyanU16)(local_c0->context->vector_unified).LL;
      pEVar53 = &Elf64_Ehdr_00100000;
      if (local_c4 == 3) {
        pEVar53 = (Elf64_Ehdr *)0x80200001;
      }
      goto LAB_001103a5;
    case '\x10':
      if (local_c0->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfd2,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(((ZydisDecodedInstruction *)pEVar35)->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfe8,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfdc,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfdf,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfe2,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfe5,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
      }
      local_c4 = (ZyanU16)(local_c0->context->vector_unified).W;
      break;
    case '\x11':
      if (local_c0->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xff1,
                      "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(((ZydisDecodedInstruction *)pEVar35)->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1007,
                      "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xffb,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xffe,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x1001,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x1004,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
      }
      local_c4 = (ZyanU16)(local_c0->context->vector_unified).B;
      break;
    case '\x12':
      if (((ZydisDecodedInstruction *)pEVar35)->encoding != ZYDIS_INSTRUCTION_ENCODING_EVEX) {
        __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1013,
                      "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x20) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 5)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1014,
                      "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      local_c4 = (ZyanU16)(((ZydisDecodedInstruction *)pEVar35)->raw).field_3.evex.b;
      break;
    case '\x13':
      if (((ZydisDecodedInstruction *)pEVar35)->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
        __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1020,
                      "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x40) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 6)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1021,
                      "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      local_c4 = (ZyanU16)(((ZydisDecodedInstruction *)pEVar35)->raw).field_3.xop.offset;
      break;
    case '\x14':
      uVar15 = (ushort)local_c0->decoder->decoder_mode >> 1;
      goto LAB_0010fe83;
    case '\x15':
      uVar15 = (ushort)local_c0->decoder->decoder_mode >> 2;
      goto LAB_0010fe83;
    case '\x16':
      uVar15 = (ushort)local_c0->decoder->decoder_mode >> 3;
      goto LAB_0010fe83;
    case '\x17':
      uVar15 = (ushort)local_c0->decoder->decoder_mode >> 4;
      goto LAB_0010fe83;
    case '\x18':
      uVar15 = (ushort)local_c0->decoder->decoder_mode >> 5;
      goto LAB_0010fe83;
    case '\x19':
      uVar15 = (ushort)local_c0->decoder->decoder_mode >> 6;
      goto LAB_0010fe83;
    case '\x1a':
      uVar15 = (ushort)local_c0->decoder->decoder_mode >> 7;
      goto LAB_0010fe83;
    case '\x1b':
      uVar15 = (ushort)*(byte *)((long)&local_c0->decoder->decoder_mode + 1);
      goto LAB_0010fe83;
    case '\x1c':
      uVar15 = (ushort)local_c0->decoder->decoder_mode >> 9;
      goto LAB_0010fe83;
    case '\x1d':
      uVar15 = (ushort)local_c0->decoder->decoder_mode >> 10;
LAB_0010fe83:
      local_c4 = uVar15 & 1;
LAB_0010fe86:
      pEVar53 = (Elf64_Ehdr *)0x0;
      goto LAB_001103a5;
    default:
      if (-1 < (char)ZVar54) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x131c,
                      "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                     );
      }
      ZydisGetInstructionDefinition
                (((ZydisDecodedInstruction *)pEVar35)->encoding,node->value,
                 (ZydisInstructionDefinition **)&local_a8);
      pZVar5 = local_c0->context;
      if (pZVar5 == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xd1a,
                      "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar8 = (ulong *)CONCAT44(local_a8._4_4_,
                                 CONCAT13(local_a8._3_1_,
                                          CONCAT12(local_a8._2_1_,
                                                   CONCAT11(local_a8._1_1_,(byte)local_a8))));
      if (puVar8 == (ulong *)0x0) {
        __assert_fail("definition",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xd1c,
                      "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      uVar31 = ((ZydisDecodedInstruction *)pEVar35)->attributes;
      bVar39 = (byte)(uVar31 >> 0x2b) & 1;
      ZVar3 = ((ZydisDecodedInstruction *)pEVar35)->machine_mode;
      if (ZVar3 == ZYDIS_MACHINE_MODE_LONG_64) {
        bVar39 = bVar39 | (pZVar5->vector_unified).W * '\x02' & 2 | 4;
      }
      else if ((ZVar3 == ZYDIS_MACHINE_MODE_LEGACY_32) ||
              (ZVar3 == ZYDIS_MACHINE_MODE_LONG_COMPAT_32)) {
        bVar39 = bVar39 | 2;
      }
      puVar45 = ZydisSetEffectiveOperandWidth_operand_size_map;
      bVar39 = ZydisSetEffectiveOperandWidth_operand_size_map
               [(ulong)bVar39 + (ulong)((uint)(*puVar8 >> 0x21) & 7) * 8];
      ((ZydisDecodedInstruction *)pEVar35)->operand_width = bVar39;
      pZVar5->eosz_index = bVar39 >> 5;
      if ((*puVar8 & 0xe00000000) == 0x200000000) {
        ((ZydisDecodedInstruction *)pEVar35)->operand_width = '\b';
      }
      bVar39 = (byte)(uVar31 >> 0x2c) & 1;
      if (ZVar3 == ZYDIS_MACHINE_MODE_LONG_64) {
        bVar39 = bVar39 | 4;
      }
      else if ((ZVar3 == ZYDIS_MACHINE_MODE_LEGACY_32) ||
              (ZVar3 == ZYDIS_MACHINE_MODE_LONG_COMPAT_32)) {
        bVar39 = bVar39 | 2;
      }
      uVar31 = (ulong)((uint)(*puVar8 >> 0x24) & 3);
      if (uVar31 == 3) {
        __assert_fail("definition->address_size_map < (sizeof(address_size_map) / sizeof((address_size_map)[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xdcc,
                      "void ZydisSetEffectiveAddressWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      bVar39 = ZydisSetEffectiveAddressWidth_address_size_map[(ulong)bVar39 + uVar31 * 8];
      ((ZydisDecodedInstruction *)pEVar35)->address_width = bVar39;
      pZVar5->easz_index = bVar39 >> 5;
      ZydisGetInstructionEncodingInfo(node,(ZydisInstructionEncodingInfo **)&local_38);
      pEVar53 = local_38;
      if (local_38 == (Elf64_Ehdr *)0x0) {
        __assert_fail("info",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xc95,
                      "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                     );
      }
      local_90 = local_c0->context;
      if ((local_38->e_ident_magic_num & 1) == 0) {
LAB_0011066f:
        if (((pEVar53->e_ident_magic_num & 2) == 0) ||
           (ZVar18 = ZydisReadDisplacement
                               (local_c0,local_b8,pEVar53->e_ident_magic_str[local_90->easz_index]),
           -1 < (int)ZVar18)) {
          if ((pEVar53->e_ident_magic_num & 4) != 0) {
            bVar39 = pEVar53->e_ident_abiversion;
            if (bVar39 != 0) {
              *(byte *)&local_b8->attributes = (byte)local_b8->attributes | 0x80;
            }
            ZVar18 = ZydisReadImmediate(local_c0,local_b8,'\0',
                                        (&pEVar53->e_ident_class)[local_90->eosz_index],
                                        pEVar53->e_ident_osabi,bVar39);
            if ((int)ZVar18 < 0) goto LAB_0011074a;
          }
          if ((pEVar53->e_ident_magic_num & 8) != 0) {
            if ((pEVar53->e_ident_magic_num & 2) != 0) {
              __assert_fail("!(info->flags & 0x02)",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0xd05,
                            "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                           );
            }
            ZVar18 = ZydisReadImmediate(local_c0,local_b8,'\x01',
                                        pEVar53->e_ident_pad[local_90->eosz_index],
                                        pEVar53->e_ident_pad[3],pEVar53->e_ident_pad[4]);
            if ((int)ZVar18 < 0) goto LAB_0011074a;
          }
          ZVar18 = 0x100000;
        }
      }
      else {
        if ((local_b8->raw).modrm.offset != '\0') {
LAB_001103ef:
          if ((pEVar53->e_ident_magic_num & 0x10) == 0) {
            ZVar14 = local_b8->address_width;
            if ((ZVar14 == '@') || (ZVar14 == ' ')) {
              ZVar14 = (local_b8->raw).modrm.mod;
              if (ZVar14 == '\x03') {
                bVar56 = false;
              }
              else {
                bVar56 = (local_b8->raw).modrm.rm == '\x04';
              }
              switch(ZVar14) {
              case '\0':
                if ((local_b8->raw).modrm.rm != '\x05') goto switchD_0011048b_caseD_3;
                ZVar14 = ' ';
                if (local_b8->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
                  *(byte *)&local_b8->attributes = (byte)local_b8->attributes | 0x80;
                }
                break;
              case '\x01':
                ZVar14 = '\b';
                break;
              case '\x02':
                ZVar14 = ' ';
                break;
              case '\x03':
switchD_0011048b_caseD_3:
                ZVar14 = '\0';
                break;
              default:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0xcd7,
                              "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                             );
              }
            }
            else {
              if (ZVar14 != '\x10') {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0xcdb,
                              "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                             );
              }
              switch((local_b8->raw).modrm.mod) {
              case '\0':
                ZVar14 = ((local_b8->raw).modrm.rm == '\x06') << 4;
                break;
              case '\x01':
                ZVar14 = '\b';
                break;
              case '\x02':
                ZVar14 = '\x10';
                break;
              case '\x03':
                ZVar14 = '\0';
                break;
              default:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0xcbb,
                              "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                             );
              }
              bVar56 = false;
            }
            ZVar18 = (ZyanStatus)pEVar35;
            if (bVar56) {
              bVar39 = local_b8->length;
              (local_b8->raw).sib.offset = bVar39;
              if (bVar39 < 0xf) {
                ZVar37 = local_c0->buffer_len;
                if (ZVar37 == 0) {
                  ZVar17 = 0x80200000;
                  bVar56 = false;
                }
                else {
                  pbVar27 = local_c0->buffer;
                  local_c0->buffer = pbVar27 + 1;
                  puVar45 = (undefined1 *)(ulong)*pbVar27;
                  local_b8->length = bVar39 + 1;
                  local_c0->buffer_len = ZVar37 - 1;
                  ZVar17 = 0x100000;
                  bVar56 = true;
                }
              }
              else {
                bVar56 = false;
                ZVar17 = 0x80200002;
              }
              if (bVar56) {
                uVar31 = local_b8->attributes;
                if ((uVar31 & 1) == 0) {
                  __assert_fail("instruction->attributes & (1ULL << 0)",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0x2c0,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
                }
                if ((local_b8->raw).modrm.rm != '\x04') {
                  __assert_fail("instruction->raw.modrm.rm == 4",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0x2c1,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
                }
                if ((uVar31 & 2) != 0) {
                  __assert_fail("!(instruction->attributes & (1ULL << 1))",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0x2c2,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
                }
                if (local_b8->length - 1 != (uint)bVar39) {
                  __assert_fail("instruction->raw.sib.offset == instruction->length - 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0x2c3,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
                }
                local_b8->attributes = uVar31 | 2;
                (local_b8->raw).sib.scale = (byte)(((ulong)puVar45 & 0xffffffff) >> 6) & 3;
                (local_b8->raw).sib.index = (byte)(((ulong)puVar45 & 0xffffffff) >> 3) & 7;
                bVar39 = (byte)puVar45 & 7;
                (local_b8->raw).sib.base = bVar39;
                ZVar17 = ZVar18;
                if ((bVar39 == 5) && (ZVar14 = ' ', (local_b8->raw).modrm.mod == '\x01')) {
                  ZVar14 = '\b';
                }
              }
              ZVar18 = ZVar17;
              if (bVar56) goto LAB_00110611;
              bVar56 = false;
            }
            else {
LAB_00110611:
              if (ZVar14 == '\0') {
                bVar56 = true;
              }
              else {
                ZVar17 = ZydisReadDisplacement(local_c0,local_b8,ZVar14);
                bVar56 = -1 < (int)ZVar17;
                if (!bVar56) {
                  ZVar18 = ZVar17;
                }
              }
            }
            if (!bVar56) goto LAB_0011074a;
          }
          bVar39 = 1;
          if ((local_b8->raw).modrm.mod != '\x03') {
            bVar39 = pEVar53->e_ident_magic_num >> 4 & 1;
          }
          (local_90->reg_info).is_mod_reg = bVar39;
          goto LAB_0011066f;
        }
        bVar39 = local_b8->length;
        (local_b8->raw).modrm.offset = bVar39;
        if (bVar39 < 0xf) {
          ZVar37 = local_c0->buffer_len;
          if (ZVar37 == 0) {
            pEVar35 = (Elf64_Ehdr *)0x80200000;
            goto LAB_001103ce;
          }
          pbVar27 = local_c0->buffer;
          local_c0->buffer = pbVar27 + 1;
          pZVar22 = (ZydisDecodedInstruction *)(ulong)*pbVar27;
          local_b8->length = bVar39 + 1;
          local_c0->buffer_len = ZVar37 - 1;
          pEVar35 = &Elf64_Ehdr_00100000;
          bVar56 = true;
        }
        else {
          pEVar35 = (Elf64_Ehdr *)0x80200002;
LAB_001103ce:
          bVar56 = false;
          pZVar22 = local_b8;
        }
        ZVar18 = (ZyanStatus)pEVar35;
        if (bVar56) {
          ZydisDecodeModRM(local_b8,(ZyanU8)pZVar22);
          goto LAB_001103ef;
        }
      }
LAB_0011074a:
      pEVar35 = (Elf64_Ehdr *)local_b8;
      if ((int)ZVar18 < 0) {
        pEVar53 = (Elf64_Ehdr *)(ulong)ZVar18;
        goto LAB_00110e31;
      }
      puVar8 = (ulong *)CONCAT44(local_a8._4_4_,
                                 CONCAT13(local_a8._3_1_,
                                          CONCAT12(local_a8._2_1_,
                                                   CONCAT11(local_a8._1_1_,(byte)local_a8))));
      if (puVar8 == (ulong *)0x0) {
        __assert_fail("definition",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1103,
                      "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      ZVar4 = local_b8->encoding;
      uVar31 = (ulong)ZVar4;
      if (5 < uVar31) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x119e,
                      "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      uVar21 = (uint)puVar8[1];
      pZVar5 = local_90;
      switch(uVar31) {
      case 0:
        if ((((*puVar8 >> 0x2d & 1) == 0) ||
            (local_b8->machine_mode != ZYDIS_MACHINE_MODE_MAX_VALUE)) &&
           (((*puVar8 >> 0x2e & 1) == 0 ||
            (1 < local_b8->machine_mode - ZYDIS_MACHINE_MODE_LONG_COMPAT_32)))) {
          bVar56 = (int)uVar21 < 0 || (local_c0->prefixes).has_lock == '\0';
          pEVar53 = (Elf64_Ehdr *)0x80200004;
        }
        else {
          pEVar53 = (Elf64_Ehdr *)0x80200001;
          bVar56 = false;
        }
        local_c1 = true;
        local_9c = 0;
        local_80 = 0;
        local_78 = 0;
        bVar39 = 0;
        if (bVar56) break;
        goto LAB_00110e06;
      case 1:
        local_c1 = true;
        local_9c = 0;
        local_80 = 0;
        local_78 = 0;
        bVar39 = 0;
        break;
      case 2:
        local_c1 = true;
        bVar39 = (byte)((uint5)puVar8[1] >> 0x1e) & 0x1f;
        local_9c = 0;
        local_80 = 0;
        local_78 = 0;
        break;
      case 3:
        bVar39 = (byte)((uint6)puVar8[1] >> 0x1e) & 0x1f;
        local_78 = (ulong)CONCAT11((char)((ushort)*(undefined2 *)((long)puVar8 + 0xc) >> 8),
                                   (byte)*(undefined2 *)((long)puVar8 + 0xc) >> 3) &
                   0xffffffffffffff01;
        local_c1 = ((uint6)puVar8[1] & 0x2000000000) == 0;
        local_9c = 0;
        local_80 = 0;
        break;
      case 4:
        local_c1 = true;
        bVar39 = (byte)((uint5)puVar8[1] >> 0x1e) & 0x1f;
        local_78 = (ulong)(*(byte *)((long)puVar8 + 0xc) >> 3) & 0xffffffffffffff01;
        local_80 = (ulong)(*(byte *)((long)puVar8 + 0xc) >> 4 & 1);
        local_9c = *(ushort *)((long)puVar8 + 0xe) >> 2 & 3;
        pEVar53 = (Elf64_Ehdr *)0x8020000a;
        if (((local_b8->raw).field_3.xop.offset != '\0') &&
           ((*(ushort *)((long)puVar8 + 0xe) & 0x10) == 0)) goto LAB_00110e06;
        break;
      case 5:
        uVar15 = *(ushort *)((long)puVar8 + 0xc);
        uVar43 = (ulong)(uVar15 >> 6 & 0x1f);
        if (0x19 < uVar43) {
          __assert_fail("def->functionality < (sizeof(lookup) / sizeof((lookup)[0]))",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x1192,
                        "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        uVar30 = (ulong)(local_b8->raw).field_3.vex.size;
        if (7 < uVar30) {
          __assert_fail("instruction->raw.mvex.SSS < 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x1193,
                        "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        pEVar53 = (Elf64_Ehdr *)0x80200001;
        if (ZydisCheckErrorConditions_lookup[uVar30 + uVar43 * 8] == '\0') goto LAB_00110e06;
        local_c1 = true;
        bVar39 = (byte)(CONCAT24(uVar15,(int)puVar8[1]) >> 0x1e) & 0x1f;
        local_78 = (ulong)CONCAT11((char)(uVar15 >> 8),(byte)uVar15 >> 3) & 0xffffffffffffff01;
        local_9c = uVar15 >> 0xb & 3;
        local_80 = 0;
      }
      uVar40 = (uint)pEVar53;
      bVar46 = (byte)(uVar21 >> 0xd);
      local_95 = bVar46 & 0x1f;
      uVar33 = uVar21 >> 0x12;
      pZVar6 = local_c0->context;
      ZVar13 = (pZVar6->reg_info).is_mod_reg;
      uVar34 = 0;
      uVar25 = (uint)(bVar46 & 0xf);
      if ((uVar21 >> 0xd & 0x1f) == 0) {
        uVar25 = 0;
      }
      local_90 = (ZydisDecoderContext *)CONCAT44(local_90._4_4_,uVar25);
      pZVar5 = local_90;
      local_96 = true;
      if ((uVar33 & 0x1f) == 0) {
        bVar56 = true;
      }
      else if (ZVar13 == '\0') {
        uVar34 = uVar33 & 0xffffff07;
        bVar56 = (uVar33 & 8) == 0;
      }
      else {
        uVar34 = uVar33 & 0xffffff0f;
        local_96 = ((byte)uVar33 & 0x1f) < 0x10;
        bVar56 = true;
      }
      if (bVar56) {
LAB_0011097e:
        if (pZVar6 == (ZydisDecoderContext *)0x0) {
          __assert_fail("context",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x1040,
                        "ZyanStatus ZydisPopulateRegisterIds(ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanU8)"
                       );
        }
        if (ZVar13 == '\0') {
          bVar56 = (local_b8->raw).modrm.rm == '\x04';
        }
        else {
          bVar56 = false;
        }
        bVar47 = (byte)uVar34;
        bVar51 = bVar47 == 4 & bVar56;
        bVar46 = (pZVar6->vector_unified).vvvv;
        bVar48 = bVar46 & 7;
        bVar44 = (local_b8->raw).modrm.reg;
        local_a9 = (local_b8->raw).modrm.rm;
        local_aa = *(byte *)((long)(local_b8->raw).imm + (ulong)bVar56 * 4 + -0x17);
        bVar12 = (local_b8->raw).sib.index;
        local_90._0_1_ = (char)uVar25;
        local_60 = (ulong)uVar25;
        bVar49 = bVar12;
        bVar50 = local_a9;
        if (local_b8->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
          bVar50 = 0;
          bVar49 = 0;
          if (bVar51 != 0) {
            bVar49 = (pZVar6->vector_unified).V2 << 4;
          }
          if (0xfffffffd < ZVar4 + ~ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
            bVar50 = (pZVar6->vector_unified).X << 4;
          }
          if (ZVar13 == '\0') {
            local_64 = 0xff;
          }
          else {
            local_64 = (uint)(byte)ZydisPopulateRegisterIds_mask_rm[bVar47];
          }
          bVar11 = (pZVar6->vector_unified).B << 3;
          bVar48 = (pZVar6->vector_unified).V2 << 4 | bVar46;
          local_aa = local_aa | bVar11;
          bVar44 = ((pZVar6->vector_unified).R << 3 | (pZVar6->vector_unified).R2 << 4 | bVar44) &
                   ZydisPopulateRegisterIds_mask_reg[local_60];
          bVar49 = bVar49 | bVar12 | (pZVar6->vector_unified).X << 3;
          local_97 = bVar12;
          bVar50 = (bVar50 | local_a9 | bVar11) & (byte)local_64;
        }
        local_ab = ZVar13;
        local_94 = uVar34;
        local_90 = pZVar5;
        local_84 = uVar40;
        local_70 = uVar31;
        if ((bVar39 == 0) &&
           (((pZVar6->vector_unified).vvvv != '\0' ||
            ((bVar51 == 0 && ((pZVar6->vector_unified).V2 != '\0')))))) {
LAB_00110cb4:
          pEVar53 = (Elf64_Ehdr *)0x80200003;
          bVar56 = false;
        }
        else {
          bVar56 = local_b8->machine_mode == ZYDIS_MACHINE_MODE_LONG_64;
          pEVar53 = (Elf64_Ehdr *)0x80200003;
          if ((byte)ZydisPopulateRegisterIds_available_regs[local_60 + (ulong)bVar56 * 0xc] <=
              bVar44) goto LAB_00110cb4;
          if ((bVar48 < (byte)ZydisPopulateRegisterIds_available_regs
                              [(ulong)bVar39 + (ulong)bVar56 * 0xc]) &&
             ((ZVar13 == '\0' ||
              (bVar50 < (byte)ZydisPopulateRegisterIds_available_regs
                              [(ulong)bVar47 + (ulong)bVar56 * 0xc])))) {
            bVar46 = bVar44;
            if ((char)local_90 != '\b') {
              bVar46 = 0xff;
            }
            bVar12 = bVar50;
            if (bVar47 != 8) {
              bVar12 = bVar46;
            }
            if (ZVar13 == '\0') {
              bVar12 = bVar46;
            }
            if (-1 < (char)bVar12) {
              if (0xf < bVar12) {
                __assert_fail("(ZyanUSize)id_cr < (sizeof(lookup) / sizeof((lookup)[0]))",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x10e1,
                              "ZyanStatus ZydisPopulateRegisterIds(ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanU8)"
                             );
              }
              if ((0xfee2UL >> ((ulong)bVar12 & 0x3f) & 1) != 0) goto LAB_00110cc1;
            }
            (pZVar6->reg_info).id_reg = -((char)local_90 == '\0') | bVar44;
            (pZVar6->reg_info).id_rm = -(ZVar13 == '\0') | -(bVar47 == 0) | bVar50;
            (pZVar6->reg_info).id_ndsndd = -(bVar39 == 0) | bVar48;
            (pZVar6->reg_info).id_base = local_aa;
            (pZVar6->reg_info).id_index = bVar49;
            pEVar53 = &Elf64_Ehdr_00100000;
            bVar56 = true;
          }
          else {
LAB_00110cc1:
            bVar56 = false;
          }
        }
        pEVar52 = (Elf64_Ehdr *)(ulong)uVar40;
        if (((bVar56) &&
            ((local_95 < 0x10 ||
             (pEVar53 = (Elf64_Ehdr *)0x80200003, (pZVar6->reg_info).id_reg != '\x01')))) &&
           (((bool)local_96 != false ||
            (pEVar53 = (Elf64_Ehdr *)0x80200003, (pZVar6->reg_info).id_rm != '\x01')))) {
          if ((char)local_78 != '\0') {
            if ((local_b8->raw).modrm.mod == '\x03') {
              __assert_fail("instruction->raw.modrm.mod != 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x11d7,
                            "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if (local_a9 != 4) {
              __assert_fail("instruction->raw.modrm.rm == 4",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x11d8,
                            "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            ZVar14 = (pZVar6->reg_info).id_index;
            ZVar24 = (pZVar6->reg_info).id_reg;
            ZVar28 = 0xf0;
            if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
              if ((((char)local_90 != '\x04') || (bVar47 != 4)) || (bVar39 != 4)) {
                __assert_fail("(def_reg == ZYDIS_REGKIND_VR) && (def_rm == ZYDIS_MEMOP_TYPE_VSIB) && (def_ndsndd == ZYDIS_REGKIND_VR)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x11e2,
                              "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                             );
              }
              ZVar28 = (pZVar6->reg_info).id_ndsndd;
            }
            if ((ZVar4 & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) == ZYDIS_INSTRUCTION_ENCODING_EVEX) {
              if (((bVar39 != 0) || ((uVar25 & 0xb) != 0)) || (bVar47 != 4)) {
                __assert_fail("((def_reg == ZYDIS_REGKIND_INVALID) || (def_reg == ZYDIS_REGKIND_VR)) && (def_rm == ZYDIS_MEMOP_TYPE_VSIB) && (def_ndsndd == ZYDIS_REGKIND_INVALID)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x11ec,
                              "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                             );
              }
              if ((char)local_90 == '\0') {
                ZVar24 = 0xf1;
              }
            }
            if ((ZVar28 == ZVar14 || ZVar24 == ZVar14) || ZVar28 == ZVar24) {
              pEVar53 = (Elf64_Ehdr *)0x80200003;
              goto LAB_00110e06;
            }
          }
          if ((char)local_80 != '\0') {
            if (1 < ZVar4 - ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
              __assert_fail("(instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) || (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x1202,
                            "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            ZVar14 = (pZVar6->reg_info).id_reg;
            if (ZVar14 == (pZVar6->reg_info).id_ndsndd) {
              pEVar52 = (Elf64_Ehdr *)0x80200003;
              bVar56 = false;
            }
            else {
              bVar57 = ZVar14 != (pZVar6->reg_info).id_rm;
              bVar56 = bVar57 || ZVar13 == '\0';
              if (!bVar57 && ZVar13 != '\0') {
                pEVar52 = (Elf64_Ehdr *)0x80200003;
              }
            }
            uVar40 = (uint)pEVar52;
            pEVar53 = pEVar52;
            if (!bVar56) goto LAB_00110e06;
          }
          if (local_c1 == false) {
            if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
              __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x1212,
                            "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if (ZVar13 == '\0') {
              __assert_fail("is_reg",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x1213,
                            "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            ZVar14 = (pZVar6->reg_info).id_reg;
            ZVar24 = (pZVar6->reg_info).id_ndsndd;
            if (ZVar14 == ZVar24) {
              pEVar53 = (Elf64_Ehdr *)0x80200003;
              bVar56 = false;
            }
            else {
              ZVar28 = (pZVar6->reg_info).id_rm;
              bVar56 = ZVar24 != ZVar28 && ZVar14 != ZVar28;
              if (ZVar24 == ZVar28 || ZVar14 == ZVar28) {
                uVar40 = 0x80200003;
              }
              pEVar53 = (Elf64_Ehdr *)(ulong)uVar40;
            }
            if (!bVar56) goto LAB_00110e06;
          }
          if (local_9c < 2) {
LAB_001112b2:
            pEVar53 = &Elf64_Ehdr_00100000;
          }
          else if (local_9c == 3) {
            pEVar53 = (Elf64_Ehdr *)0x8020000a;
            if ((pZVar6->vector_unified).mask == '\0') goto LAB_001112b2;
          }
          else {
            if ((pZVar6->vector_unified).mask != '\0') goto LAB_001112b2;
            pEVar53 = (Elf64_Ehdr *)0x8020000a;
          }
        }
      }
      else {
        bVar56 = true;
        if ((local_c0->decoder->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) &&
           ((local_b8->raw).modrm.mod == '\0')) {
          bVar56 = (local_b8->raw).modrm.rm != '\x05';
        }
        pEVar53 = (Elf64_Ehdr *)((ulong)pEVar53 & 0xffffffff);
        if (!bVar56) {
          pEVar53 = (Elf64_Ehdr *)0x80200003;
        }
        uVar40 = (uint)pEVar53;
        if (bVar56) goto LAB_0011097e;
      }
LAB_00110e06:
      local_90 = pZVar5;
      if ((int)pEVar53 < 0) goto LAB_00110e31;
      if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_3DNOW) {
        bVar39 = local_b8->length;
        if (bVar39 < 0xf) {
          if (local_c0->buffer_len == 0) {
            uVar21 = 0x80200000;
            goto LAB_00110ea3;
          }
          pZVar32 = local_c0->buffer;
          local_c0->buffer = pZVar32 + 1;
          local_b8->opcode = *pZVar32;
          local_b8->length = bVar39 + 1;
          local_c0->buffer_len = local_c0->buffer_len - 1;
          uVar21 = 0x100000;
          bVar56 = true;
        }
        else {
          uVar21 = 0x80200002;
LAB_00110ea3:
          bVar56 = false;
        }
        if (bVar56) {
          pZVar23 = ZydisDecoderTreeGetChildNode(&zydis_decoder_tree_root,0xf);
          pZVar23 = ZydisDecoderTreeGetChildNode(pZVar23,0xf);
          node = ZydisDecoderTreeGetChildNode
                           (pZVar23,(ushort)((ZydisDecodedInstruction *)pEVar35)->opcode);
          pEVar53 = (Elf64_Ehdr *)0x80200001;
          if (node->type != '\0') {
            if (node->type != '\b') {
              __assert_fail("node->type == ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x12e6,
                            "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                           );
            }
            node = ZydisDecoderTreeGetChildNode
                             (node,(ushort)((((ZydisDecodedInstruction *)pEVar35)->raw).modrm.mod !=
                                           '\x03'));
            if (-1 < (char)node->type) {
              __assert_fail("node->type & ZYDIS_NODETYPE_DEFINITION_MASK",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x12e9,
                            "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                           );
            }
            ZydisGetInstructionDefinition
                      (((ZydisDecodedInstruction *)pEVar35)->encoding,node->value,
                       (ZydisInstructionDefinition **)&local_a8);
            goto LAB_00110f30;
          }
        }
        else {
          pEVar53 = (Elf64_Ehdr *)(ulong)uVar21;
        }
        goto LAB_00110e31;
      }
LAB_00110f30:
      pZVar9 = (ZydisMnemonic *)
               CONCAT44(local_a8._4_4_,
                        CONCAT13(local_a8._3_1_,
                                 CONCAT12(local_a8._2_1_,CONCAT11(local_a8._1_1_,(byte)local_a8))));
      ((ZydisDecodedInstruction *)pEVar35)->mnemonic =
           *pZVar9 & (ZYDIS_MNEMONIC_XSHA256|ZYDIS_MNEMONIC_FUCOM);
      ((ZydisDecodedInstruction *)pEVar35)->operand_count = (byte)(*pZVar9 >> 0xb) & 0xf;
      ((ZydisDecodedInstruction *)pEVar35)->operand_count_visible = (byte)(*pZVar9 >> 0xf) & 7;
      pZVar5 = local_c0->context;
      pZVar5->definition = pZVar9;
      puVar10 = (undefined8 *)
                CONCAT44(local_a8._4_4_,
                         CONCAT13(local_a8._3_1_,
                                  CONCAT12(local_a8._2_1_,CONCAT11(local_a8._1_1_,(byte)local_a8))))
      ;
      ZVar29 = (ZydisInstructionCategory)((ulong)*puVar10 >> 0x2f) &
               (ZYDIS_CATEGORY_WRMSRNS|ZYDIS_CATEGORY_BINARY);
      (((ZydisDecodedInstruction *)pEVar35)->meta).category = ZVar29;
      (((ZydisDecodedInstruction *)pEVar35)->meta).isa_set =
           (ZydisISASet)((ulong)*puVar10 >> 0x36) &
           (ZYDIS_ISA_SET_WAITPKG|ZYDIS_ISA_SET_AVX512_VBMI_256);
      (((ZydisDecodedInstruction *)pEVar35)->meta).isa_ext =
           (uint)((ulong)*puVar10 >> 0x3e) + *(int *)(puVar10 + 1) * 4 &
           (ZYDIS_ISA_EXT_VTX|ZYDIS_ISA_EXT_F16C);
      ZVar36 = *(uint *)(puVar10 + 1) >> 5 & ZYDIS_BRANCH_TYPE_FAR;
      (((ZydisDecodedInstruction *)pEVar35)->meta).branch_type = ZVar36;
      if (((ZVar36 != ZYDIS_BRANCH_TYPE_NONE) &&
          ((0x3c < ZVar29 - ZYDIS_CATEGORY_CALL ||
           ((0x1000000000000101U >> ((ulong)(ZVar29 - ZYDIS_CATEGORY_CALL) & 0x3f) & 1) == 0)))) &&
         (ZVar29 != ZYDIS_CATEGORY_UNCOND_BR)) {
        __assert_fail("(instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_NONE) || ((instruction->meta.category == ZYDIS_CATEGORY_CALL) || (instruction->meta.category == ZYDIS_CATEGORY_COND_BR) || (instruction->meta.category == ZYDIS_CATEGORY_UNCOND_BR) || (instruction->meta.category == ZYDIS_CATEGORY_RET))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x12fd,
                      "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                     );
      }
      (((ZydisDecodedInstruction *)pEVar35)->meta).exception_class =
           *(uint *)(puVar10 + 1) >> 7 & (ZYDIS_EXCEPTION_CLASS_E10|ZYDIS_EXCEPTION_CLASS_E9NF);
      uVar21 = local_c0->decoder->decoder_mode;
      pEVar53 = &Elf64_Ehdr_00100000;
      if ((uVar21 & 1) != 0) goto LAB_00110e31;
      if ((*(uint *)(puVar10 + 1) >> 0x17 & 3) != 0) {
        ((ZydisDecodedInstruction *)pEVar35)->attributes =
             ((ZydisDecodedInstruction *)pEVar35)->attributes |
             *(ulong *)(ZydisSetAttributes_mapping +
                       (ulong)((byte)(*(uint *)(puVar10 + 1) >> 0x17) & 3) * 8);
      }
      if ((*(uint *)(puVar10 + 1) >> 0x19 & 3) != 0) {
        ((ZydisDecodedInstruction *)pEVar35)->attributes =
             ((ZydisDecodedInstruction *)pEVar35)->attributes |
             *(ulong *)(ZydisSetAttributes_mapping_60 +
                       (ulong)((byte)(*(uint *)(puVar10 + 1) >> 0x19) & 3) * 8);
      }
      if ((*(uint *)(puVar10 + 1) >> 0x1b & 3) != 0) {
        ((ZydisDecodedInstruction *)pEVar35)->attributes =
             ((ZydisDecodedInstruction *)pEVar35)->attributes |
             *(ulong *)(ZydisSetAttributes_mapping_62 +
                       (ulong)((byte)(*(uint *)(puVar10 + 1) >> 0x1b) & 3) * 8);
      }
      ZVar4 = ((ZydisDecodedInstruction *)pEVar35)->encoding;
      if (ZVar4 - ZYDIS_INSTRUCTION_ENCODING_3DNOW < 5) {
        if ((*(byte *)((long)puVar10 + 0xb) & 0x20) != 0) {
          uVar31 = ((ZydisDecodedInstruction *)pEVar35)->attributes;
          ((ZydisDecodedInstruction *)pEVar35)->attributes = uVar31 | 0x4000000;
          bVar39 = (local_c0->prefixes).effective_segment;
          if (bVar39 < 0x36) {
            if (bVar39 == 0) goto LAB_00111605;
            if (bVar39 == 0x26) {
LAB_001115cc:
              uVar43 = 0x10004000000;
            }
            else {
              uVar43 = 0x2004000000;
              if (bVar39 != 0x2e) goto LAB_00112ad5;
            }
          }
          else if (bVar39 < 100) {
            if (bVar39 != 0x36) {
              if (bVar39 != 0x3e) {
LAB_00112ad5:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x8cd,
                              "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                             );
              }
              goto LAB_0011109b;
            }
LAB_001115c0:
            uVar43 = 0x4004000000;
          }
          else if (bVar39 == 100) {
LAB_001115f4:
            uVar43 = 0x20004000000;
          }
          else {
            if (bVar39 != 0x65) goto LAB_00112ad5;
LAB_00111235:
            uVar43 = 0x40004000000;
          }
LAB_001115fe:
          ((ZydisDecodedInstruction *)pEVar35)->attributes = uVar31 | uVar43;
LAB_00111605:
          if ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x7e000000000) != 0) {
            (((ZydisDecodedInstruction *)pEVar35)->raw).prefixes
            [(local_c0->prefixes).offset_segment].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
        }
      }
      else {
        if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x8d8,
                        "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if ((*(byte *)((long)puVar10 + 0xb) & 0x40) != 0) {
          pbVar27 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar35)->attributes + 1);
          *pbVar27 = *pbVar27 | 1;
        }
        if (*(int *)(puVar10 + 1) < 0) {
          uVar31 = ((ZydisDecodedInstruction *)pEVar35)->attributes;
          ((ZydisDecodedInstruction *)pEVar35)->attributes = uVar31 | 0x10000;
          if ((local_c0->prefixes).has_lock != '\0') {
            ((ZydisDecodedInstruction *)pEVar35)->attributes = uVar31 | 0x8010000;
            (((ZydisDecodedInstruction *)pEVar35)->raw).prefixes[(local_c0->prefixes).offset_lock].
            type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
        }
        if ((*(byte *)((long)puVar10 + 0xc) & 1) != 0) {
          pbVar27 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar35)->attributes + 2);
          *pbVar27 = *pbVar27 | 2;
        }
        if ((*(byte *)((long)puVar10 + 0xc) & 2) != 0) {
          pbVar27 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar35)->attributes + 2);
          *pbVar27 = *pbVar27 | 4;
        }
        if ((*(byte *)((long)puVar10 + 0xc) & 4) != 0) {
          pbVar27 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar35)->attributes + 2);
          *pbVar27 = *pbVar27 | 8;
        }
        if ((*(byte *)((long)puVar10 + 0xc) & 8) != 0) {
          pbVar27 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar35)->attributes + 2);
          *pbVar27 = *pbVar27 | 0x10;
        }
        if ((*(byte *)((long)puVar10 + 0xc) & 0x10) != 0) {
          pbVar27 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar35)->attributes + 2);
          *pbVar27 = *pbVar27 | 0x20;
        }
        if ((*(byte *)((long)puVar10 + 0xc) & 0x20) != 0) {
          pbVar27 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar35)->attributes + 2);
          *pbVar27 = *pbVar27 | 0x40;
        }
        if ((*(byte *)((long)puVar10 + 0xc) & 0x80) != 0) {
          pbVar27 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar35)->attributes + 2);
          *pbVar27 = *pbVar27 | 0x80;
        }
        ZVar14 = (local_c0->prefixes).group1;
        if (ZVar14 == 0xf3) {
          uVar31 = ((ZydisDecodedInstruction *)pEVar35)->attributes;
          uVar40 = (uint)uVar31;
          if ((uVar40 >> 0x11 & 1) == 0) {
            if ((uVar40 >> 0x12 & 1) == 0) {
              if (((uVar40 >> 0x16 & 1) == 0) ||
                 (((uVar40 >> 0x1b & 1) == 0 && ((*(byte *)((long)puVar10 + 0xc) & 0x80) == 0))))
              goto LAB_00111494;
              ZVar41 = uVar31 | 0x200000000;
            }
            else {
              ZVar41 = uVar31 | 0x20000000;
            }
          }
          else {
            ZVar41 = uVar31 | 0x10000000;
          }
LAB_00111490:
          ((ZydisDecodedInstruction *)pEVar35)->attributes = ZVar41;
        }
        else if (ZVar14 == 0xf2) {
          uVar31 = ((ZydisDecodedInstruction *)pEVar35)->attributes;
          uVar40 = (uint)uVar31;
          if ((uVar40 >> 0x13 & 1) == 0) {
            if (((uVar40 >> 0x15 & 1) == 0) ||
               (((uVar40 >> 0x1b & 1) == 0 && ((*(byte *)((long)puVar10 + 0xc) & 0x80) == 0)))) {
              if ((uVar40 >> 0x14 & 1) == 0 || (uVar21 & 8) == 0) goto LAB_00111494;
              ZVar41 = uVar31 | 0x80000000;
            }
            else {
              ZVar41 = uVar31 | 0x100000000;
            }
          }
          else {
            ZVar41 = uVar31 | 0x40000000;
          }
          goto LAB_00111490;
        }
LAB_00111494:
        bVar39 = (local_c0->prefixes).offset_group1;
        if (((((ZydisDecodedInstruction *)pEVar35)->raw).prefixes[bVar39].type ==
             ZYDIS_PREFIX_TYPE_IGNORED) &&
           ((((ZydisDecodedInstruction *)pEVar35)->attributes & 0x3f0000000) != 0)) {
          (((ZydisDecodedInstruction *)pEVar35)->raw).prefixes[bVar39].type =
               ZYDIS_PREFIX_TYPE_EFFECTIVE;
        }
        if ((*(byte *)((long)puVar10 + 0xd) & 1) != 0) {
          uVar31 = ((ZydisDecodedInstruction *)pEVar35)->attributes;
          ((ZydisDecodedInstruction *)pEVar35)->attributes = uVar31 | 0x1000000;
          ZVar14 = (local_c0->prefixes).group2;
          uVar43 = local_48;
          if (ZVar14 != '.') {
            if (ZVar14 != '>') goto LAB_00111512;
            uVar43 = 0x801000000;
          }
          ((ZydisDecodedInstruction *)pEVar35)->attributes = uVar31 | uVar43;
          (((ZydisDecodedInstruction *)pEVar35)->raw).prefixes[(local_c0->prefixes).offset_group2].
          type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
        }
LAB_00111512:
        if ((*(byte *)((long)puVar10 + 0xc) & 0x40) != 0) {
          uVar31 = ((ZydisDecodedInstruction *)pEVar35)->attributes;
          ((ZydisDecodedInstruction *)pEVar35)->attributes = uVar31 | 0x2000000;
          if (((uVar21 & 0x10) != 0) &&
             (lVar38 = (long)(local_c0->prefixes).offset_notrack, -1 < lVar38)) {
            ((ZydisDecodedInstruction *)pEVar35)->attributes = uVar31 | 0x1002000000;
            (((ZydisDecodedInstruction *)pEVar35)->raw).prefixes[lVar38].type =
                 ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
        }
        if (((*(byte *)((long)puVar10 + 0xb) & 0x20) != 0) &&
           ((*(byte *)((long)puVar10 + 0xd) & 1) == 0)) {
          uVar31 = ((ZydisDecodedInstruction *)pEVar35)->attributes;
          ((ZydisDecodedInstruction *)pEVar35)->attributes = uVar31 | 0x4000000;
          bVar39 = (local_c0->prefixes).effective_segment;
          if ((uVar31 >> 0x24 & 1) == 0 && bVar39 != 0) {
            if (bVar39 < 0x3e) {
              if (bVar39 == 0x26) goto LAB_001115cc;
              uVar43 = 0x2004000000;
              if (bVar39 != 0x2e) {
                if (bVar39 != 0x36) {
LAB_00112e58:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0x8a2,
                                "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                               );
                }
                goto LAB_001115c0;
              }
            }
            else {
              if (bVar39 != 0x3e) {
                if (bVar39 == 100) goto LAB_001115f4;
                if (bVar39 != 0x65) goto LAB_00112e58;
                goto LAB_00111235;
              }
LAB_0011109b:
              uVar43 = 0x8004000000;
            }
            goto LAB_001115fe;
          }
          goto LAB_00111605;
        }
      }
      if (3 < ZVar4 - ZYDIS_INSTRUCTION_ENCODING_XOP) goto switchD_0011164e_default;
      if (pZVar5 == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x8ff,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      switch(ZVar4 - ZYDIS_INSTRUCTION_ENCODING_XOP) {
      case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        uVar31 = (ulong)(pZVar5->vector_unified).LL;
        if (1 < uVar31) {
          __assert_fail("context->vector_unified.LL < (sizeof(lookup) / sizeof((lookup)[0]))",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x90d,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        (((ZydisDecodedInstruction *)pEVar35)->avx).vector_length =
             *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_65 + uVar31 * 2);
        break;
      case ZYDIS_INSTRUCTION_ENCODING_3DNOW:
        uVar31 = (ulong)(pZVar5->vector_unified).LL;
        if (1 < uVar31) {
          __assert_fail("context->vector_unified.LL < (sizeof(lookup) / sizeof((lookup)[0]))",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x919,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        (((ZydisDecodedInstruction *)pEVar35)->avx).vector_length =
             *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_65 + uVar31 * 2);
        if ((*(ushort *)((long)puVar10 + 0xc) & 0x1c0) != 0) {
          (((ZydisDecodedInstruction *)pEVar35)->avx).broadcast.is_static = '\x01';
          (((ZydisDecodedInstruction *)pEVar35)->avx).broadcast.mode =
               *(ZydisBroadcastMode *)
                (ZydisSetAVXInformation_broadcasts +
                (ulong)(*(ushort *)((long)puVar10 + 0xc) >> 6 & 7) * 4);
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        bVar39 = (pZVar5->vector_unified).LL;
        bVar46 = *(byte *)((long)puVar10 + 0xc) >> 6;
        bVar44 = bVar46 - 1;
        if (bVar46 == 0) {
          bVar44 = bVar39;
        }
        if (2 < bVar44) {
          __assert_fail("vector_length < (sizeof(lookup) / sizeof((lookup)[0]))",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x942,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        uVar31 = (ulong)bVar44;
        ZVar1 = *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_66 + uVar31 * 2);
        (((ZydisDecodedInstruction *)pEVar35)->avx).vector_length = ZVar1;
        (pZVar5->evex).tuple_type = *(byte *)((long)puVar10 + 0xd) & 0x1f;
        bVar46 = *(byte *)((long)puVar10 + 0xd);
        if ((bVar46 & 0x1f) == 0) {
          if ((((ZydisDecodedInstruction *)pEVar35)->raw).modrm.mod != '\x03') {
            __assert_fail("instruction->raw.modrm.mod == 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa7e,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          goto LAB_00111e4f;
        }
        if ((((ZydisDecodedInstruction *)pEVar35)->raw).modrm.mod == '\x03') {
          __assert_fail("instruction->raw.modrm.mod != 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x948,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if (bVar46 < 0x20) {
          __assert_fail("def->element_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x949,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if (0xbf < bVar46) {
          __assert_fail("def->element_size < (sizeof(element_sizes) / sizeof((element_sizes)[0]))",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x950,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        bVar50 = bVar46 >> 5;
        bVar12 = *(byte *)((long)&ZydisSetAVXInformation_element_sizes + (ulong)bVar50);
        (pZVar5->evex).element_size = bVar12;
        bVar49 = *(byte *)((long)puVar10 + 0xd);
        pEVar35 = (Elf64_Ehdr *)local_b8;
        switch(bVar49 & 0x1f) {
        case 1:
          uVar43 = (ulong)(local_b8->raw).field_3.evex.b;
          if (1 < uVar43) {
            __assert_fail("evex_b < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x959,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (uVar43 != 0) {
            bVar56 = (bVar46 & 0xc0) != 0x40;
            if ((pZVar5->vector_unified).W != '\0') {
              bVar56 = bVar50 != 4;
            }
            if (bVar56) {
              __assert_fail("!evex_b || ((!context->vector_unified.W && (context->evex.element_size == 16 || context->evex.element_size == 32)) || ( context->vector_unified.W && context->evex.element_size == 64))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x95c,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if ((*(ushort *)((long)puVar10 + 0xe) & 3) != 1) {
              __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x95d,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
          }
          if (bVar50 == 5) {
            __assert_fail("size_index < 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x993,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          pZVar5->cd8_scale =
               ZydisSetAVXInformation_scales[uVar31 + (ulong)(bVar12 >> 5) * 3 + uVar43 * 9];
          puVar45 = ZydisSetAVXInformation_broadcasts_73 +
                    (ulong)(bVar12 >> 5) * 0xc + uVar43 * 0x24;
          goto LAB_00111d3c;
        case 2:
          uVar43 = (ulong)(local_b8->raw).field_3.evex.b;
          if (1 < uVar43) {
            __assert_fail("evex_b < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x99c,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((pZVar5->vector_unified).W != '\0') {
            __assert_fail("!context->vector_unified.W",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x99d,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((bVar46 & 0xc0) != 0x40) {
            __assert_fail("(context->evex.element_size == 16) || (context->evex.element_size == 32)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x99f,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((uVar43 != 0) && ((*(ushort *)((long)puVar10 + 0xe) & 3) != 1)) {
            __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x9a0,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (bVar50 == 5) {
            __assert_fail("size_index < 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x9ca,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          lVar38 = (ulong)(bVar12 >> 5) * 3;
          pZVar5->cd8_scale = ZydisSetAVXInformation_scales_77[uVar31 + lVar38 + uVar43 * 6];
          puVar45 = ZydisSetAVXInformation_broadcasts_78 + uVar43 * 0x18;
          goto LAB_00111d38;
        case 3:
          puVar42 = &ZydisSetAVXInformation_scales_79;
          break;
        case 4:
          goto switchD_0011171f_caseD_4;
        case 5:
          if (bVar50 == 5) {
            __assert_fail("size_index < 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x9ff,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          ZVar14 = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_90 + (ulong)(bVar12 >> 5));
          goto LAB_00111e46;
        case 6:
          if (bVar50 != 3) {
            __assert_fail("context->evex.element_size == 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa05,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((pZVar5->vector_unified).W != '\0') {
            __assert_fail("context->vector_unified.W == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa06,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
        case 0xe:
          pZVar5->cd8_scale = '\x10';
          goto LAB_00111e4f;
        case 7:
          ZVar14 = (pZVar5->vector_unified).W;
          if (ZVar14 == '\x01') {
            if (bVar50 != 4) {
              __assert_fail("context->evex.element_size == 64",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x9e0,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
          }
          else {
            if (ZVar14 != '\0') {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x9e3,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if (bVar50 != 3) {
              __assert_fail("context->evex.element_size == 32",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x9dd,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
          }
          goto switchD_0011171f_caseD_4;
        case 8:
          ZVar14 = (pZVar5->vector_unified).W;
          if (ZVar14 == '\x01') {
            if (bVar50 != 4) {
              __assert_fail("context->evex.element_size == 64",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0xa11,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if ((ZVar1 != 0x100) && (ZVar1 != 0x200)) {
              __assert_fail("(instruction->avx.vector_length == 256) || (instruction->avx.vector_length == 512)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0xa13,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
LAB_00111f58:
            pZVar5->cd8_scale = '\x10';
          }
          else {
            if (ZVar14 != '\0') {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0xa17,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if (bVar50 != 3) {
              __assert_fail("context->evex.element_size == 32",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0xa0d,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            pZVar5->cd8_scale = '\b';
          }
          goto LAB_00111e4f;
        case 9:
          ZVar14 = (pZVar5->vector_unified).W;
          if (ZVar14 != '\x01') {
            if (ZVar14 != '\0') {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0xa29,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if (bVar50 != 3) {
              __assert_fail("context->evex.element_size == 32",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0xa1e,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if ((ZVar1 != 0x100) && (ZVar1 != 0x200)) {
              __assert_fail("(instruction->avx.vector_length == 256) || (instruction->avx.vector_length == 512)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0xa20,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            goto LAB_00111f58;
          }
          if (bVar50 != 4) {
            __assert_fail("context->evex.element_size == 64",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa24,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (bVar44 != 2) {
            __assert_fail("instruction->avx.vector_length == 512",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa25,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          goto LAB_00111e1d;
        case 10:
          if ((pZVar5->vector_unified).W != '\0') {
            __assert_fail("!context->vector_unified.W",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa2d,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (bVar44 != 2) {
            __assert_fail("instruction->avx.vector_length == 512",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa2e,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (bVar50 != 3) {
            __assert_fail("context->evex.element_size == 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa2f,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
LAB_00111e1d:
          pZVar5->cd8_scale = ' ';
          goto LAB_00111e4f;
        case 0xb:
          puVar42 = &ZydisSetAVXInformation_scales_88;
          break;
        case 0xc:
          puVar42 = &ZydisSetAVXInformation_scales_89;
          break;
        case 0xd:
          puVar42 = &ZydisSetAVXInformation_scales_90;
          break;
        case 0xf:
          puVar42 = &ZydisSetAVXInformation_scales_91;
          break;
        case 0x10:
          uVar43 = (ulong)(local_b8->raw).field_3.evex.b;
          if (1 < uVar43) {
            __assert_fail("evex_b < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa5c,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((pZVar5->vector_unified).W != '\0') {
            __assert_fail("!context->vector_unified.W",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa5d,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (bVar50 != 2) {
            __assert_fail("context->evex.element_size == 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa5e,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((uVar43 != 0) && ((*(ushort *)((long)puVar10 + 0xe) & 3) != 1)) {
            __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa5f,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          lVar38 = uVar43 * 3;
          pZVar5->cd8_scale = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_93 + uVar31 + lVar38)
          ;
          puVar45 = ZydisSetAVXInformation_broadcasts_94;
LAB_00111d38:
          puVar45 = puVar45 + lVar38 * 4;
LAB_00111d3c:
          (local_b8->avx).broadcast.mode = *(ZydisBroadcastMode *)(puVar45 + uVar31 * 4);
          goto LAB_00111e4f;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xa7a,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        ZVar14 = *(ZyanU8 *)(uVar31 + (long)puVar42);
LAB_00111e46:
        pZVar5->cd8_scale = ZVar14;
LAB_00111e4f:
        if ((*(ushort *)((long)puVar10 + 0xe) & 0x780) != 0) {
          if ((((ZydisDecodedInstruction *)pEVar35)->avx).broadcast.mode !=
              ZYDIS_BROADCAST_MODE_INVALID) {
            __assert_fail("!instruction->avx.broadcast.mode",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa84,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          (((ZydisDecodedInstruction *)pEVar35)->avx).broadcast.is_static = '\x01';
          uVar21 = *(ushort *)((long)puVar10 + 0xe) >> 7 & 0xf;
          if (0xc < (ushort)uVar21) {
            __assert_fail("def->broadcast < (sizeof(broadcasts) / sizeof((broadcasts)[0]))",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa96,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          (((ZydisDecodedInstruction *)pEVar35)->avx).broadcast.mode =
               *(ZydisBroadcastMode *)(ZydisSetAVXInformation_broadcasts_97 + (ulong)uVar21 * 4);
        }
        if (((((ZydisDecodedInstruction *)pEVar35)->raw).field_3.evex.b != '\0') &&
           (uVar15 = *(ushort *)((long)puVar10 + 0xe) & 3, 1 < uVar15)) {
          if (uVar15 != 3) {
            (((ZydisDecodedInstruction *)pEVar35)->avx).rounding.mode =
                 bVar39 + ZYDIS_ROUNDING_MODE_RN;
          }
          (((ZydisDecodedInstruction *)pEVar35)->avx).has_sae = '\x01';
        }
        bVar39 = (((ZydisDecodedInstruction *)pEVar35)->raw).field_3.evex.aaa;
        (((ZydisDecodedInstruction *)pEVar35)->avx).mask.reg = bVar39 + ZYDIS_REGISTER_K0;
        switch(*(ushort *)((long)puVar10 + 0xe) >> 5 & 3) {
        case 0:
          iVar16 = 2;
          break;
        case 1:
          ZVar19 = ZYDIS_MASK_MODE_REQUIRED_BITS;
          goto LAB_00111ef3;
        case 2:
          iVar16 = 4;
          break;
        case 3:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xabc,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        ZVar19 = (uint)(((ZydisDecodedInstruction *)pEVar35)->raw).field_3.xop.offset + iVar16;
LAB_00111ef3:
        if (bVar39 == 0) {
          ZVar19 = ZYDIS_MASK_MODE_DISABLED;
        }
        (((ZydisDecodedInstruction *)pEVar35)->avx).mask.mode = ZVar19;
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        (((ZydisDecodedInstruction *)pEVar35)->avx).vector_length = 0x200;
        uVar7 = *(uint3 *)((long)puVar10 + 0xc);
        if ((uVar7 & 0x1c000) != 0 && (uVar7 & 0x2000) != 0) {
          __assert_fail("!index || !def->broadcast",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xad2,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        uVar21 = uVar7 >> 0xd & 1;
        uVar31 = (ulong)uVar21;
        bVar56 = true;
        if ((char)uVar21 != '\0' || (uVar7 & 0x1c000) == 0) goto LAB_001118cd;
        (((ZydisDecodedInstruction *)pEVar35)->avx).broadcast.is_static = '\x01';
        switch(*(uint3 *)((long)puVar10 + 0xc) >> 0xe & 7) {
        case 1:
          (((ZydisDecodedInstruction *)pEVar35)->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_8;
          break;
        case 2:
          (((ZydisDecodedInstruction *)pEVar35)->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_16;
          break;
        case 3:
          (((ZydisDecodedInstruction *)pEVar35)->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_8;
          goto LAB_001118b8;
        case 4:
          (((ZydisDecodedInstruction *)pEVar35)->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_16;
LAB_001118b8:
          uVar31 = 2;
          bVar56 = false;
          goto LAB_001118cd;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xae9,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        uVar31 = 1;
LAB_001118cd:
        switch(*(ushort *)((long)puVar10 + 0xc) >> 6 & 0x1f) {
        case 0:
        case 1:
        case 2:
        case 3:
        case 8:
        case 9:
          goto switchD_001118ee_caseD_0;
        case 4:
        case 5:
        case 6:
        case 7:
          ZVar14 = '@';
          goto LAB_00111979;
        case 10:
        case 0xb:
        case 0xc:
        case 0x12:
          uVar43 = (ulong)(((ZydisDecodedInstruction *)pEVar35)->raw).field_3.vex.size;
          if (7 < uVar43) {
            __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xb09,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          puVar45 = ZydisSetAVXInformation_lookup_100;
          break;
        case 0xd:
        case 0x11:
        case 0x13:
        case 0x15:
          uVar43 = (ulong)(((ZydisDecodedInstruction *)pEVar35)->raw).field_3.vex.size;
          if (2 < uVar43) {
            __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xb27,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          pZVar32 = ZydisSetAVXInformation_lookup_103 + uVar31 * 3 + uVar43;
          goto LAB_00111977;
        case 0xe:
        case 0xf:
        case 0x10:
        case 0x14:
          uVar43 = (ulong)(((ZydisDecodedInstruction *)pEVar35)->raw).field_3.vex.size;
          if (7 < uVar43) {
            __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xb18,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          puVar45 = ZydisSetAVXInformation_lookup_102;
          break;
        case 0x16:
        case 0x18:
          if (!bVar56) {
            __assert_fail("index < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xb33,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          uVar43 = (ulong)(((ZydisDecodedInstruction *)pEVar35)->raw).field_3.vex.size;
          if (7 < uVar43) {
            __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xb34,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          puVar45 = ZydisSetAVXInformation_lookup_104;
          break;
        case 0x17:
        case 0x19:
          if (!bVar56) {
            __assert_fail("index < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xb40,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((((ZydisDecodedInstruction *)pEVar35)->raw).field_3.vex.size != '\0') {
            __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xb41,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          pZVar32 = (ZyanU8 *)((long)&ZydisSetAVXInformation_lookup_106 + uVar31);
          goto LAB_00111977;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xb46,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        pZVar32 = puVar45 + uVar43 + uVar31 * 8;
LAB_00111977:
        ZVar14 = *pZVar32;
LAB_00111979:
        pZVar5->cd8_scale = ZVar14;
switchD_001118ee_caseD_0:
        (pZVar5->mvex).functionality = (byte)(*(ushort *)((long)puVar10 + 0xc) >> 6) & 0x1f;
        switch(*(ushort *)((long)puVar10 + 0xc) >> 6 & 0x1f) {
        case 0:
        case 1:
        case 4:
        case 5:
        case 6:
        case 7:
        case 0x13:
        case 0x15:
        case 0x17:
        case 0x19:
          break;
        case 2:
          (((ZydisDecodedInstruction *)pEVar35)->avx).rounding.mode =
               ((((ZydisDecodedInstruction *)pEVar35)->raw).field_3.vex.size & 3) +
               ZYDIS_ROUNDING_MODE_RN;
        case 3:
          if (3 < (((ZydisDecodedInstruction *)pEVar35)->raw).field_3.vex.size) {
            (((ZydisDecodedInstruction *)pEVar35)->avx).has_sae = '\x01';
          }
          break;
        case 8:
        case 9:
          (((ZydisDecodedInstruction *)pEVar35)->avx).swizzle.mode =
               (((ZydisDecodedInstruction *)pEVar35)->raw).field_3.vex.size +
               ZYDIS_SWIZZLE_MODE_DCBA;
          break;
        case 10:
        case 0xb:
        case 0xc:
          switch((((ZydisDecodedInstruction *)pEVar35)->raw).field_3.vex.size) {
          case '\0':
            break;
          case '\x01':
switchD_00111a1d_caseD_1:
            (((ZydisDecodedInstruction *)pEVar35)->avx).broadcast.mode =
                 ZYDIS_BROADCAST_MODE_1_TO_16;
            break;
          case '\x02':
switchD_00111a1d_caseD_2:
            (((ZydisDecodedInstruction *)pEVar35)->avx).broadcast.mode =
                 ZYDIS_BROADCAST_MODE_4_TO_16;
            break;
          case '\x03':
switchD_00111a80_caseD_3:
            (((ZydisDecodedInstruction *)pEVar35)->avx).conversion.mode =
                 ZYDIS_CONVERSION_MODE_FLOAT16;
            break;
          case '\x04':
switchD_00111aad_caseD_4:
            (((ZydisDecodedInstruction *)pEVar35)->avx).conversion.mode =
                 ZYDIS_CONVERSION_MODE_REQUIRED_BITS;
            break;
          case '\x05':
switchD_00111aad_caseD_5:
            (((ZydisDecodedInstruction *)pEVar35)->avx).conversion.mode =
                 ZYDIS_CONVERSION_MODE_SINT8;
            break;
          case '\x06':
switchD_00111aad_caseD_6:
            (((ZydisDecodedInstruction *)pEVar35)->avx).conversion.mode =
                 ZYDIS_CONVERSION_MODE_MAX_VALUE;
            break;
          case '\a':
switchD_00111aad_caseD_7:
            (((ZydisDecodedInstruction *)pEVar35)->avx).conversion.mode =
                 ZYDIS_CONVERSION_MODE_SINT16;
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xb7f,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          break;
        case 0xd:
        case 0x11:
          ZVar14 = (((ZydisDecodedInstruction *)pEVar35)->raw).field_3.vex.size;
          if (ZVar14 != '\0') {
            if (ZVar14 == '\x02') {
              (((ZydisDecodedInstruction *)pEVar35)->avx).broadcast.mode =
                   ZYDIS_BROADCAST_MODE_4_TO_8;
            }
            else {
              if (ZVar14 != '\x01') {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0xbac,
                              "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                             );
              }
              (((ZydisDecodedInstruction *)pEVar35)->avx).broadcast.mode =
                   ZYDIS_BROADCAST_MODE_1_TO_8;
            }
          }
          break;
        case 0xe:
        case 0xf:
        case 0x10:
          switch((((ZydisDecodedInstruction *)pEVar35)->raw).field_3.vex.size) {
          case '\0':
            break;
          case '\x01':
            goto switchD_00111a1d_caseD_1;
          case '\x02':
            goto switchD_00111a1d_caseD_2;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xb9c,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          case '\x04':
            goto switchD_00111aad_caseD_4;
          case '\x05':
            goto switchD_00111aad_caseD_5;
          case '\x06':
            goto switchD_00111aad_caseD_6;
          case '\a':
            goto switchD_00111aad_caseD_7;
          }
        case 0x12:
        case 0x16:
          switch((((ZydisDecodedInstruction *)pEVar35)->raw).field_3.vex.size) {
          case '\0':
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xbc5,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          case '\x03':
            goto switchD_00111a80_caseD_3;
          case '\x04':
            goto switchD_00111aad_caseD_4;
          case '\x05':
            goto switchD_00111aad_caseD_5;
          case '\x06':
            goto switchD_00111aad_caseD_6;
          case '\a':
            goto switchD_00111aad_caseD_7;
          }
        case 0x14:
        case 0x18:
          switch((((ZydisDecodedInstruction *)pEVar35)->raw).field_3.vex.size) {
          case '\0':
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xbde,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          case '\x04':
            goto switchD_00111aad_caseD_4;
          case '\x05':
            goto switchD_00111aad_caseD_5;
          case '\x06':
            goto switchD_00111aad_caseD_6;
          case '\a':
            goto switchD_00111aad_caseD_7;
          }
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xbe5,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if (((((ZydisDecodedInstruction *)pEVar35)->raw).modrm.mod != '\x03') &&
           ((((ZydisDecodedInstruction *)pEVar35)->raw).field_3.xop.offset != '\0')) {
          (((ZydisDecodedInstruction *)pEVar35)->avx).has_eviction_hint = '\x01';
        }
        (((ZydisDecodedInstruction *)pEVar35)->avx).mask.mode = ZYDIS_MASK_MODE_MERGING;
        (((ZydisDecodedInstruction *)pEVar35)->avx).mask.reg =
             (((ZydisDecodedInstruction *)pEVar35)->raw).field_3.evex.b + ZYDIS_REGISTER_K0;
      }
switchD_0011164e_default:
      ZVar13 = ZydisGetAccessedFlags
                         ((ZydisInstructionDefinition *)
                          CONCAT44(local_a8._4_4_,
                                   CONCAT13(local_a8._3_1_,
                                            CONCAT12(local_a8._2_1_,
                                                     CONCAT11(local_a8._1_1_,(byte)local_a8)))),
                          &local_40);
      if (ZVar13 != '\0') {
        pbVar27 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar35)->attributes + 1);
        *pbVar27 = *pbVar27 | 2;
      }
      ((ZydisDecodedInstruction *)pEVar35)->cpu_flags = &local_40->cpu_flags;
      ((ZydisDecodedInstruction *)pEVar35)->fpu_flags = &local_40->fpu_flags;
      goto LAB_00110e31;
    }
    pEVar53 = &Elf64_Ehdr_00100000;
    pZVar26 = pZVar23;
LAB_001103a5:
    unaff_R12 = (Elf64_Ehdr *)((ulong)unaff_R12 & 0xffffffff);
    if ((int)pEVar53 < 0) {
LAB_00110e31:
      iVar16 = 1;
      unaff_R12 = pEVar53;
    }
    else {
      node = ZydisDecoderTreeGetChildNode(node,local_c4);
      iVar16 = 0;
    }
LAB_00110e39:
    if ((iVar16 != 3) && (iVar16 != 0)) {
      return (ZyanStatus)unaff_R12;
    }
    pZVar23 = pZVar26;
    if ((char)ZVar54 < '\x01') {
      return 0x100000;
    }
  } while( true );
switchD_0011171f_caseD_4:
  if (0xbf < bVar49) {
    __assert_fail("def->element_size < (sizeof(scales) / sizeof((scales)[0]))",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x9f1,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar14 = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_82 + (ulong)(bVar49 >> 5));
  goto LAB_00111e46;
}

Assistant:

static ZyanStatus ZydisDecodeInstruction(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);

    // Iterate through the decoder tree
    const ZydisDecoderTreeNode* node = ZydisDecoderTreeGetRootNode();
    const ZydisDecoderTreeNode* temp = ZYAN_NULL;
    ZydisDecoderTreeNodeType node_type;
    do
    {
        node_type = node->type;
        ZyanU16 index = 0;
        ZyanStatus status = 0;
        switch (node_type)
        {
        case ZYDIS_NODETYPE_INVALID:
            if (temp)
            {
                node = temp;
                temp = ZYAN_NULL;
                node_type = ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX;
                if (state->prefixes.mandatory_candidate != 0x00)
                {
                    instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
                        ZYDIS_PREFIX_TYPE_IGNORED;
                }
                if (state->prefixes.mandatory_candidate == 0x66)
                {
                    if (state->prefixes.offset_osz_override ==
                        state->prefixes.offset_mandatory)
                    {
                        instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
                            ZYDIS_PREFIX_TYPE_EFFECTIVE;
                    }
                    instruction->attributes |= ZYDIS_ATTRIB_HAS_OPERANDSIZE;
                }
                continue;
            }
            return ZYDIS_STATUS_DECODING_ERROR;
        case ZYDIS_NODETYPE_FILTER_XOP:
            status = ZydisNodeHandlerXOP(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_VEX:
            status = ZydisNodeHandlerVEX(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_EMVEX:
            status = ZydisNodeHandlerEMVEX(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_OPCODE:
            status = ZydisNodeHandlerOpcode(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODE:
            status = ZydisNodeHandlerMode(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_COMPACT:
            status = ZydisNodeHandlerModeCompact(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_MOD:
            status = ZydisNodeHandlerModrmMod(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT:
            status = ZydisNodeHandlerModrmModCompact(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_REG:
            status = ZydisNodeHandlerModrmReg(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_RM:
            status = ZydisNodeHandlerModrmRm(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_PREFIX_GROUP1:
            index = state->prefixes.group1 ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX:
            status = ZydisNodeHandlerMandatoryPrefix(state, instruction, &index);
            temp = ZydisDecoderTreeGetChildNode(node, 0);
            // TODO: Return to this point, if index == 0 contains a value and the previous path
            // TODO: was not successful
            // TODO: Restore consumed prefix
            break;
        case ZYDIS_NODETYPE_FILTER_OPERAND_SIZE:
            status = ZydisNodeHandlerOperandSize(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_ADDRESS_SIZE:
            status = ZydisNodeHandlerAddressSize(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_VECTOR_LENGTH:
            status = ZydisNodeHandlerVectorLength(state->context, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_REX_W:
            status = ZydisNodeHandlerRexW(state->context, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_REX_B:
            status = ZydisNodeHandlerRexB(state->context, instruction, &index);
            break;
#ifndef ZYDIS_DISABLE_AVX512
        case ZYDIS_NODETYPE_FILTER_EVEX_B:
            status = ZydisNodeHandlerEvexB(instruction, &index);
            break;
#endif
#ifndef ZYDIS_DISABLE_KNC
        case ZYDIS_NODETYPE_FILTER_MVEX_E:
            status = ZydisNodeHandlerMvexE(instruction, &index);
            break;
#endif
        case ZYDIS_NODETYPE_FILTER_MODE_AMD:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_AMD_BRANCHES));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_KNC:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_KNC));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_MPX:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_MPX));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_CET:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_CET));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_LZCNT:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_LZCNT));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_TZCNT:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_TZCNT));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_WBNOINVD:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_WBNOINVD));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_CLDEMOTE:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_CLDEMOTE));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_IPREFETCH:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_IPREFETCH));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_UD0_COMPAT:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_UD0_COMPAT));
            break;
        default:
            if (node_type & ZYDIS_NODETYPE_DEFINITION_MASK)
            {
                const ZydisInstructionDefinition* definition;
                ZydisGetInstructionDefinition(instruction->encoding, node->value, &definition);
                ZydisSetEffectiveOperandWidth(state->context, instruction, definition);
                ZydisSetEffectiveAddressWidth(state->context, instruction, definition);

                const ZydisInstructionEncodingInfo* info;
                ZydisGetInstructionEncodingInfo(node, &info);
                ZYAN_CHECK(ZydisDecodeOptionalInstructionParts(state, instruction, info));
                ZYAN_CHECK(ZydisCheckErrorConditions(state, instruction, definition));

                if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_3DNOW)
                {
                    // Get actual 3DNOW opcode and definition
                    ZYAN_CHECK(ZydisInputNext(state, instruction, &instruction->opcode));
                    node = ZydisDecoderTreeGetRootNode();
                    node = ZydisDecoderTreeGetChildNode(node, 0x0F);
                    node = ZydisDecoderTreeGetChildNode(node, 0x0F);
                    node = ZydisDecoderTreeGetChildNode(node, instruction->opcode);
                    if (node->type == ZYDIS_NODETYPE_INVALID)
                    {
                        return ZYDIS_STATUS_DECODING_ERROR;
                    }
                    ZYAN_ASSERT(node->type == ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT);
                    node = ZydisDecoderTreeGetChildNode(
                        node, (instruction->raw.modrm.mod == 0x3) ? 0 : 1);
                    ZYAN_ASSERT(node->type & ZYDIS_NODETYPE_DEFINITION_MASK);
                    ZydisGetInstructionDefinition(instruction->encoding, node->value, &definition);
                }

                instruction->mnemonic = definition->mnemonic;

#ifndef ZYDIS_MINIMAL_MODE

                instruction->operand_count = definition->operand_count;
                instruction->operand_count_visible = definition->operand_count_visible;
                state->context->definition = definition;

                instruction->meta.category = definition->category;
                instruction->meta.isa_set = definition->isa_set;
                instruction->meta.isa_ext = definition->isa_ext;
                instruction->meta.branch_type = definition->branch_type;
                ZYAN_ASSERT((instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_NONE) ||
                        ((instruction->meta.category == ZYDIS_CATEGORY_CALL) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_COND_BR) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_UNCOND_BR) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_RET)));
                instruction->meta.exception_class = definition->exception_class;

                if (!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_MINIMAL)))
                {
                    ZydisSetAttributes(state, instruction, definition);
                    switch (instruction->encoding)
                    {
                    case ZYDIS_INSTRUCTION_ENCODING_XOP:
                    case ZYDIS_INSTRUCTION_ENCODING_VEX:
                    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
                    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
                        ZydisSetAVXInformation(state->context, instruction, definition);
                        break;
                    default:
                        break;
                    }

                    const ZydisDefinitionAccessedFlags* flags;
                    if (ZydisGetAccessedFlags(definition, &flags))
                    {
                        instruction->attributes |= ZYDIS_ATTRIB_CPUFLAG_ACCESS;
                    }
                    instruction->cpu_flags = &flags->cpu_flags;
                    instruction->fpu_flags = &flags->fpu_flags;
                }

#endif

                return ZYAN_STATUS_SUCCESS;
            }
            ZYAN_UNREACHABLE;
        }
        ZYAN_CHECK(status);
        node = ZydisDecoderTreeGetChildNode(node, index);
    } while ((node_type != ZYDIS_NODETYPE_INVALID) && !(node_type & ZYDIS_NODETYPE_DEFINITION_MASK));
    return ZYAN_STATUS_SUCCESS;
}